

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx2::CurveNiIntersectorK<4,4>::
     occluded_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  Primitive PVar1;
  Geometry *pGVar2;
  RTCFilterFunctionN p_Var3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  ulong uVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  uint uVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar62;
  uint uVar63;
  byte bVar64;
  ulong uVar65;
  bool bVar66;
  byte bVar67;
  float fVar68;
  undefined8 uVar70;
  float fVar94;
  vint4 bi_2;
  undefined1 auVar71 [16];
  float fVar93;
  float fVar95;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar69;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar75 [16];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar96;
  float fVar126;
  float fVar127;
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar114 [32];
  float fVar128;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar106 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar113 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar151;
  float fVar152;
  float fVar153;
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  vint4 ai_2;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar172;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar164 [16];
  undefined1 auVar171 [32];
  vint4 ai;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar173 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  vint4 bi;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [28];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar198;
  float fVar207;
  float fVar208;
  vint4 ai_1;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar210;
  float fVar211;
  float fVar212;
  undefined1 auVar203 [32];
  float fVar209;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar213 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar214 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar241 [32];
  undefined1 auVar258 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  float fVar240;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  float fVar245;
  float fVar246;
  float fVar247;
  undefined1 auVar244 [64];
  float fVar252;
  undefined1 auVar248 [16];
  float fVar253;
  undefined1 auVar250 [32];
  undefined1 auVar249 [16];
  float fVar254;
  float fVar255;
  float fVar256;
  undefined1 auVar251 [64];
  undefined1 auVar257 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  float fVar263;
  undefined1 auVar261 [64];
  undefined1 auVar262 [64];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [16];
  undefined1 auVar271 [32];
  undefined1 auVar272 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c04;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8b0 [16];
  undefined1 local_8a0 [16];
  Primitive *local_890;
  ulong local_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined4 uStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  uint local_720;
  uint uStack_71c;
  uint uStack_718;
  uint uStack_714;
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [16];
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined4 local_660;
  undefined4 uStack_65c;
  undefined4 uStack_658;
  undefined4 uStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined4 uStack_648;
  undefined4 uStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  float local_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  
  PVar1 = prim[1];
  uVar59 = (ulong)(byte)PVar1;
  fVar68 = *(float *)(prim + uVar59 * 0x19 + 0x12);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar4 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar4 = vsubps_avx(auVar4,*(undefined1 (*) [16])(prim + uVar59 * 0x19 + 6));
  auVar71._0_4_ = fVar68 * auVar4._0_4_;
  auVar71._4_4_ = fVar68 * auVar4._4_4_;
  auVar71._8_4_ = fVar68 * auVar4._8_4_;
  auVar71._12_4_ = fVar68 * auVar4._12_4_;
  auVar134._0_4_ = fVar68 * auVar5._0_4_;
  auVar134._4_4_ = fVar68 * auVar5._4_4_;
  auVar134._8_4_ = fVar68 * auVar5._8_4_;
  auVar134._12_4_ = fVar68 * auVar5._12_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xb + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xc + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xd + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x12 + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x13 + 6)));
  auVar73 = vcvtdq2ps_avx(auVar73);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x14 + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar264._4_4_ = auVar134._0_4_;
  auVar264._0_4_ = auVar134._0_4_;
  auVar264._8_4_ = auVar134._0_4_;
  auVar264._12_4_ = auVar134._0_4_;
  auVar98 = vshufps_avx(auVar134,auVar134,0x55);
  auVar72 = vshufps_avx(auVar134,auVar134,0xaa);
  fVar68 = auVar72._0_4_;
  auVar235._0_4_ = fVar68 * auVar6._0_4_;
  fVar93 = auVar72._4_4_;
  auVar235._4_4_ = fVar93 * auVar6._4_4_;
  fVar94 = auVar72._8_4_;
  auVar235._8_4_ = fVar94 * auVar6._8_4_;
  fVar95 = auVar72._12_4_;
  auVar235._12_4_ = fVar95 * auVar6._12_4_;
  auVar230._0_4_ = auVar9._0_4_ * fVar68;
  auVar230._4_4_ = auVar9._4_4_ * fVar93;
  auVar230._8_4_ = auVar9._8_4_ * fVar94;
  auVar230._12_4_ = auVar9._12_4_ * fVar95;
  auVar213._0_4_ = auVar132._0_4_ * fVar68;
  auVar213._4_4_ = auVar132._4_4_ * fVar93;
  auVar213._8_4_ = auVar132._8_4_ * fVar94;
  auVar213._12_4_ = auVar132._12_4_ * fVar95;
  auVar72 = vfmadd231ps_fma(auVar235,auVar98,auVar5);
  auVar99 = vfmadd231ps_fma(auVar230,auVar98,auVar8);
  auVar98 = vfmadd231ps_fma(auVar213,auVar73,auVar98);
  auVar154 = vfmadd231ps_fma(auVar72,auVar264,auVar4);
  auVar99 = vfmadd231ps_fma(auVar99,auVar264,auVar7);
  auVar77 = vfmadd231ps_fma(auVar98,auVar74,auVar264);
  auVar265._4_4_ = auVar71._0_4_;
  auVar265._0_4_ = auVar71._0_4_;
  auVar265._8_4_ = auVar71._0_4_;
  auVar265._12_4_ = auVar71._0_4_;
  auVar98 = vshufps_avx(auVar71,auVar71,0x55);
  auVar72 = vshufps_avx(auVar71,auVar71,0xaa);
  fVar68 = auVar72._0_4_;
  auVar184._0_4_ = fVar68 * auVar6._0_4_;
  fVar93 = auVar72._4_4_;
  auVar184._4_4_ = fVar93 * auVar6._4_4_;
  fVar94 = auVar72._8_4_;
  auVar184._8_4_ = fVar94 * auVar6._8_4_;
  fVar95 = auVar72._12_4_;
  auVar184._12_4_ = fVar95 * auVar6._12_4_;
  auVar97._0_4_ = auVar9._0_4_ * fVar68;
  auVar97._4_4_ = auVar9._4_4_ * fVar93;
  auVar97._8_4_ = auVar9._8_4_ * fVar94;
  auVar97._12_4_ = auVar9._12_4_ * fVar95;
  auVar72._0_4_ = auVar132._0_4_ * fVar68;
  auVar72._4_4_ = auVar132._4_4_ * fVar93;
  auVar72._8_4_ = auVar132._8_4_ * fVar94;
  auVar72._12_4_ = auVar132._12_4_ * fVar95;
  auVar5 = vfmadd231ps_fma(auVar184,auVar98,auVar5);
  auVar6 = vfmadd231ps_fma(auVar97,auVar98,auVar8);
  auVar8 = vfmadd231ps_fma(auVar72,auVar98,auVar73);
  auVar9 = vfmadd231ps_fma(auVar5,auVar265,auVar4);
  auVar73 = vfmadd231ps_fma(auVar6,auVar265,auVar7);
  auVar227._8_4_ = 0x7fffffff;
  auVar227._0_8_ = 0x7fffffff7fffffff;
  auVar227._12_4_ = 0x7fffffff;
  auVar132 = vfmadd231ps_fma(auVar8,auVar265,auVar74);
  auVar4 = vandps_avx(auVar154,auVar227);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar5 = vblendvps_avx(auVar154,auVar173,auVar4);
  auVar4 = vandps_avx(auVar99,auVar227);
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar6 = vblendvps_avx(auVar99,auVar173,auVar4);
  auVar4 = vandps_avx(auVar227,auVar77);
  auVar4 = vcmpps_avx(auVar4,auVar173,1);
  auVar4 = vblendvps_avx(auVar77,auVar173,auVar4);
  auVar7 = vrcpps_avx(auVar5);
  auVar214._8_4_ = 0x3f800000;
  auVar214._0_8_ = 0x3f8000003f800000;
  auVar214._12_4_ = 0x3f800000;
  auVar5 = vfnmadd213ps_fma(auVar5,auVar7,auVar214);
  auVar7 = vfmadd132ps_fma(auVar5,auVar7,auVar7);
  auVar5 = vrcpps_avx(auVar6);
  auVar6 = vfnmadd213ps_fma(auVar6,auVar5,auVar214);
  auVar8 = vfmadd132ps_fma(auVar6,auVar5,auVar5);
  auVar5 = vrcpps_avx(auVar4);
  auVar4 = vfnmadd213ps_fma(auVar4,auVar5,auVar214);
  auVar74 = vfmadd132ps_fma(auVar4,auVar5,auVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar4 = vpmovsxwd_avx(auVar4);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar6 = vsubps_avx(auVar4,auVar9);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar4 = vpmovsxwd_avx(auVar5);
  auVar77._0_4_ = auVar7._0_4_ * auVar6._0_4_;
  auVar77._4_4_ = auVar7._4_4_ * auVar6._4_4_;
  auVar77._8_4_ = auVar7._8_4_ * auVar6._8_4_;
  auVar77._12_4_ = auVar7._12_4_ * auVar6._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar9);
  auVar185._0_4_ = auVar7._0_4_ * auVar4._0_4_;
  auVar185._4_4_ = auVar7._4_4_ * auVar4._4_4_;
  auVar185._8_4_ = auVar7._8_4_ * auVar4._8_4_;
  auVar185._12_4_ = auVar7._12_4_ * auVar4._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar59 * 0xe + 6);
  auVar4 = vpmovsxwd_avx(auVar6);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar5 = vsubps_avx(auVar4,auVar73);
  auVar99._1_3_ = 0;
  auVar99[0] = PVar1;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar1 * 0x10 + 6);
  auVar4 = vpmovsxwd_avx(auVar7);
  auVar199._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar199._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar199._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar199._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar73);
  auVar98._0_4_ = auVar8._0_4_ * auVar4._0_4_;
  auVar98._4_4_ = auVar8._4_4_ * auVar4._4_4_;
  auVar98._8_4_ = auVar8._8_4_ * auVar4._8_4_;
  auVar98._12_4_ = auVar8._12_4_ * auVar4._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar59 * 0x15 + 6);
  auVar4 = vpmovsxwd_avx(auVar8);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar132);
  auVar154._0_4_ = auVar74._0_4_ * auVar4._0_4_;
  auVar154._4_4_ = auVar74._4_4_ * auVar4._4_4_;
  auVar154._8_4_ = auVar74._8_4_ * auVar4._8_4_;
  auVar154._12_4_ = auVar74._12_4_ * auVar4._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar59 * 0x17 + 6);
  auVar4 = vpmovsxwd_avx(auVar9);
  auVar4 = vcvtdq2ps_avx(auVar4);
  auVar4 = vsubps_avx(auVar4,auVar132);
  auVar73._0_4_ = auVar74._0_4_ * auVar4._0_4_;
  auVar73._4_4_ = auVar74._4_4_ * auVar4._4_4_;
  auVar73._8_4_ = auVar74._8_4_ * auVar4._8_4_;
  auVar73._12_4_ = auVar74._12_4_ * auVar4._12_4_;
  auVar4 = vpminsd_avx(auVar77,auVar185);
  auVar5 = vpminsd_avx(auVar199,auVar98);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  auVar5 = vpminsd_avx(auVar154,auVar73);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar231._4_4_ = uVar69;
  auVar231._0_4_ = uVar69;
  auVar231._8_4_ = uVar69;
  auVar231._12_4_ = uVar69;
  auVar5 = vmaxps_avx(auVar5,auVar231);
  auVar4 = vmaxps_avx(auVar4,auVar5);
  local_5a0._0_4_ = auVar4._0_4_ * 0.99999964;
  local_5a0._4_4_ = auVar4._4_4_ * 0.99999964;
  local_5a0._8_4_ = auVar4._8_4_ * 0.99999964;
  local_5a0._12_4_ = auVar4._12_4_ * 0.99999964;
  auVar4 = vpmaxsd_avx(auVar77,auVar185);
  auVar5 = vpmaxsd_avx(auVar199,auVar98);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar5 = vpmaxsd_avx(auVar154,auVar73);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar69;
  auVar132._0_4_ = uVar69;
  auVar132._8_4_ = uVar69;
  auVar132._12_4_ = uVar69;
  auVar5 = vminps_avx(auVar5,auVar132);
  auVar4 = vminps_avx(auVar4,auVar5);
  auVar74._0_4_ = auVar4._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar4._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar4._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar4._12_4_ * 1.0000004;
  auVar99[4] = PVar1;
  auVar99._5_3_ = 0;
  auVar99[8] = PVar1;
  auVar99._9_3_ = 0;
  auVar99[0xc] = PVar1;
  auVar99._13_3_ = 0;
  auVar5 = vpcmpgtd_avx(auVar99,_DAT_01f4ad30);
  auVar4 = vcmpps_avx(local_5a0,auVar74,2);
  auVar4 = vandps_avx(auVar4,auVar5);
  auVar114._16_16_ = mm_lookupmask_ps._240_16_;
  auVar114._0_16_ = mm_lookupmask_ps._240_16_;
  uVar63 = vmovmskps_avx(auVar4);
  local_520 = vblendps_avx(auVar114,ZEXT832(0) << 0x20,0x80);
  local_890 = prim;
LAB_01141515:
  local_888 = (ulong)uVar63;
  if (local_888 == 0) {
LAB_01143b7f:
    return local_888 != 0;
  }
  lVar60 = 0;
  for (uVar59 = local_888; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    lVar60 = lVar60 + 1;
  }
  uVar63 = *(uint *)(local_890 + 2);
  local_720 = *(uint *)(local_890 + lVar60 * 4 + 6);
  pGVar2 = (context->scene->geometries).items[uVar63].ptr;
  lVar60 = *(long *)&pGVar2[1].time_range.upper;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar2->field_0x58 +
                           (ulong)local_720 *
                           pGVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar4 = *(undefined1 (*) [16])(lVar60 + (long)pGVar2[1].intersectionFilterN * uVar59);
  auVar5 = *(undefined1 (*) [16])(lVar60 + (long)pGVar2[1].intersectionFilterN * (uVar59 + 1));
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar7 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar248._4_4_ = uVar69;
  auVar248._0_4_ = uVar69;
  auVar248._8_4_ = uVar69;
  auVar248._12_4_ = uVar69;
  fStack_630 = (float)uVar69;
  _local_640 = auVar248;
  fStack_62c = (float)uVar69;
  fStack_628 = (float)uVar69;
  register0x0000151c = uVar69;
  uVar69 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar257._4_4_ = uVar69;
  auVar257._0_4_ = uVar69;
  auVar257._8_4_ = uVar69;
  auVar257._12_4_ = uVar69;
  fStack_7b0 = (float)uVar69;
  _local_7c0 = auVar257;
  fStack_7ac = (float)uVar69;
  fStack_7a8 = (float)uVar69;
  register0x0000155c = uVar69;
  auVar6 = vunpcklps_avx(auVar248,auVar257);
  fVar68 = *(float *)(ray + k * 4 + 0x60);
  auVar270._4_4_ = fVar68;
  auVar270._0_4_ = fVar68;
  auVar270._8_4_ = fVar68;
  auVar270._12_4_ = fVar68;
  fStack_7d0 = fVar68;
  _local_7e0 = auVar270;
  fStack_7cc = fVar68;
  fStack_7c8 = fVar68;
  uStack_7c4 = fVar68;
  local_950 = vinsertps_avx(auVar6,auVar270,0x28);
  auVar186._8_4_ = 0xbeaaaaab;
  auVar186._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar186._12_4_ = 0xbeaaaaab;
  auVar74 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar2[2].intersectionFilterN +
                              uVar59 * (long)pGVar2[2].pointQueryFunc),auVar4,auVar186);
  auVar9 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar2[2].intersectionFilterN +
                            (long)pGVar2[2].pointQueryFunc * (uVar59 + 1)),auVar5,auVar186);
  auVar187._0_4_ = (auVar5._0_4_ + auVar4._0_4_ + auVar74._0_4_ + auVar9._0_4_) * 0.25;
  auVar187._4_4_ = (auVar5._4_4_ + auVar4._4_4_ + auVar74._4_4_ + auVar9._4_4_) * 0.25;
  auVar187._8_4_ = (auVar5._8_4_ + auVar4._8_4_ + auVar74._8_4_ + auVar9._8_4_) * 0.25;
  auVar187._12_4_ = (auVar5._12_4_ + auVar4._12_4_ + auVar74._12_4_ + auVar9._12_4_) * 0.25;
  auVar6 = vsubps_avx(auVar187,auVar7);
  auVar6 = vdpps_avx(auVar6,local_950,0x7f);
  local_960 = vdpps_avx(local_950,local_950,0x7f);
  auVar234 = ZEXT1664(local_960);
  auVar8 = vrcpss_avx(local_960,local_960);
  auVar73 = vfnmadd213ss_fma(auVar8,local_960,ZEXT416(0x40000000));
  local_3c0 = auVar6._0_4_ * auVar8._0_4_ * auVar73._0_4_;
  auVar226 = ZEXT464((uint)local_3c0);
  auVar200._4_4_ = local_3c0;
  auVar200._0_4_ = local_3c0;
  auVar200._8_4_ = local_3c0;
  auVar200._12_4_ = local_3c0;
  fStack_870 = local_3c0;
  _local_880 = auVar200;
  fStack_86c = local_3c0;
  fStack_868 = local_3c0;
  fStack_864 = local_3c0;
  auVar6 = vfmadd231ps_fma(auVar7,local_950,auVar200);
  auVar6 = vblendps_avx(auVar6,_DAT_01f45a50,8);
  auVar7 = vsubps_avx(auVar4,auVar6);
  auVar8 = vsubps_avx(auVar9,auVar6);
  auVar9 = vsubps_avx(auVar74,auVar6);
  auVar74 = vsubps_avx(auVar5,auVar6);
  auVar4 = vmovshdup_avx(auVar7);
  uVar70 = auVar4._0_8_;
  auVar144._8_8_ = uVar70;
  auVar144._0_8_ = uVar70;
  auVar144._16_8_ = uVar70;
  auVar144._24_8_ = uVar70;
  auVar4 = vshufps_avx(auVar7,auVar7,0xaa);
  uVar70 = auVar4._0_8_;
  auVar203._8_8_ = uVar70;
  auVar203._0_8_ = uVar70;
  auVar203._16_8_ = uVar70;
  auVar203._24_8_ = uVar70;
  auVar4 = vshufps_avx(auVar7,auVar7,0xff);
  uVar70 = auVar4._0_8_;
  local_380._8_8_ = uVar70;
  local_380._0_8_ = uVar70;
  local_380._16_8_ = uVar70;
  local_380._24_8_ = uVar70;
  auVar4 = vmovshdup_avx(auVar9);
  local_940 = auVar4._0_8_;
  auVar4 = vshufps_avx(auVar9,auVar9,0xaa);
  uVar70 = auVar4._0_8_;
  local_900._8_8_ = uVar70;
  local_900._0_8_ = uVar70;
  local_900._16_8_ = uVar70;
  local_900._24_8_ = uVar70;
  auVar244 = ZEXT3264(local_900);
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  uVar70 = auVar5._0_8_;
  auVar266._8_8_ = uVar70;
  auVar266._0_8_ = uVar70;
  auVar266._16_8_ = uVar70;
  auVar266._24_8_ = uVar70;
  auVar4 = vmovshdup_avx(auVar8);
  local_4e0 = auVar4._0_4_;
  fStack_4dc = auVar4._4_4_;
  auVar4 = vshufps_avx(auVar8,auVar8,0xaa);
  local_1e0 = auVar4._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar4 = vshufps_avx(auVar8,auVar8,0xff);
  local_500 = auVar4._0_4_;
  fStack_4fc = auVar4._4_4_;
  auVar4 = vmovshdup_avx(auVar74);
  local_200 = auVar4._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar4 = vshufps_avx(auVar74,auVar74,0xaa);
  local_220 = auVar4._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar4 = vshufps_avx(auVar74,auVar74,0xff);
  local_240 = auVar4._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar4 = vfmadd231ps_fma(ZEXT432((uint)(fVar68 * fVar68)),_local_7c0,_local_7c0);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),_local_640,_local_640);
  uVar69 = auVar4._0_4_;
  local_260._4_4_ = uVar69;
  local_260._0_4_ = uVar69;
  local_260._8_4_ = uVar69;
  local_260._12_4_ = uVar69;
  local_260._16_4_ = uVar69;
  local_260._20_4_ = uVar69;
  local_260._24_4_ = uVar69;
  local_260._28_4_ = uVar69;
  fVar68 = *(float *)(ray + k * 4 + 0x30);
  local_8b0 = ZEXT416((uint)local_3c0);
  local_3c0 = fVar68 - local_3c0;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  uVar59 = 0;
  bVar64 = 0;
  local_c04 = 1;
  local_3a0._0_4_ = auVar7._0_4_;
  local_3a0._4_4_ = local_3a0._0_4_;
  local_3a0._8_4_ = local_3a0._0_4_;
  local_3a0._12_4_ = local_3a0._0_4_;
  local_3a0._16_4_ = local_3a0._0_4_;
  local_3a0._20_4_ = local_3a0._0_4_;
  local_3a0._24_4_ = local_3a0._0_4_;
  local_3a0._28_4_ = local_3a0._0_4_;
  fVar94 = auVar9._0_4_;
  auVar237._4_4_ = fVar94;
  auVar237._0_4_ = fVar94;
  auVar237._8_4_ = fVar94;
  auVar237._12_4_ = fVar94;
  auVar237._16_4_ = fVar94;
  auVar237._20_4_ = fVar94;
  auVar237._24_4_ = fVar94;
  auVar237._28_4_ = fVar94;
  fVar95 = auVar8._0_4_;
  local_280 = fVar95;
  fStack_27c = fVar95;
  fStack_278 = fVar95;
  fStack_274 = fVar95;
  fStack_270 = fVar95;
  fStack_26c = fVar95;
  fStack_268 = fVar95;
  fStack_264 = fVar95;
  fVar93 = auVar74._0_4_;
  local_2a0 = fVar93;
  fStack_29c = fVar93;
  fStack_298 = fVar93;
  fStack_294 = fVar93;
  fStack_290 = fVar93;
  fStack_28c = fVar93;
  fStack_288 = fVar93;
  fStack_284 = fVar93;
  local_800._8_4_ = 0x7fffffff;
  local_800._0_8_ = 0x7fffffff7fffffff;
  local_800._12_4_ = 0x7fffffff;
  local_800._16_4_ = 0x7fffffff;
  local_800._20_4_ = 0x7fffffff;
  local_800._24_4_ = 0x7fffffff;
  local_800._28_4_ = 0x7fffffff;
  local_580 = vandps_avx(local_260,local_800);
  auVar4 = vsqrtss_avx(local_960,local_960);
  auVar6 = vsqrtss_avx(local_960,local_960);
  auVar261 = ZEXT3264(local_900);
  auVar251 = ZEXT3264(CONCAT824(local_940,CONCAT816(local_940,CONCAT88(local_940,local_940))));
  local_590 = ZEXT816(0x3f80000000000000);
  local_9a0 = auVar237;
  uStack_938 = local_940;
  uStack_930 = local_940;
  uStack_928 = local_940;
  uStack_71c = local_720;
  uStack_718 = local_720;
  uStack_714 = local_720;
  local_710 = uVar63;
  uStack_70c = uVar63;
  uStack_708 = uVar63;
  uStack_704 = uVar63;
  local_560 = auVar203;
  local_540 = auVar144;
  fStack_4f8 = local_500;
  fStack_4f4 = fStack_4fc;
  fStack_4f0 = local_500;
  fStack_4ec = fStack_4fc;
  fStack_4e8 = local_500;
  fStack_4e4 = fStack_4fc;
  fStack_4d8 = local_4e0;
  fStack_4d4 = fStack_4dc;
  fStack_4d0 = local_4e0;
  fStack_4cc = fStack_4dc;
  fStack_4c8 = local_4e0;
  fStack_4c4 = fStack_4dc;
  do {
    auVar180._8_4_ = 0x3f800000;
    auVar180._0_8_ = 0x3f8000003f800000;
    auVar180._12_4_ = 0x3f800000;
    auVar180._16_4_ = 0x3f800000;
    auVar180._20_4_ = 0x3f800000;
    auVar180._24_4_ = 0x3f800000;
    auVar180._28_4_ = 0x3f800000;
    auVar73 = vmovshdup_avx(local_590);
    auVar73 = vsubps_avx(auVar73,local_590);
    fVar129 = auVar73._0_4_;
    fVar131 = fVar129 * 0.04761905;
    local_760._0_4_ = local_590._0_4_;
    local_760._4_4_ = local_760._0_4_;
    local_760._8_4_ = local_760._0_4_;
    local_760._12_4_ = local_760._0_4_;
    local_760._16_4_ = local_760._0_4_;
    local_760._20_4_ = local_760._0_4_;
    local_760._24_4_ = local_760._0_4_;
    local_760._28_4_ = local_760._0_4_;
    local_780._4_4_ = fVar129;
    local_780._0_4_ = fVar129;
    local_780._8_4_ = fVar129;
    local_780._12_4_ = fVar129;
    local_780._16_4_ = fVar129;
    local_780._20_4_ = fVar129;
    local_780._24_4_ = fVar129;
    local_780._28_4_ = fVar129;
    auVar73 = vfmadd231ps_fma(local_760,local_780,_DAT_01f7b040);
    auVar114 = vsubps_avx(auVar180,ZEXT1632(auVar73));
    fVar96 = auVar73._0_4_;
    auVar272._0_4_ = auVar237._0_4_ * fVar96;
    fVar126 = auVar73._4_4_;
    auVar272._4_4_ = auVar237._4_4_ * fVar126;
    fVar127 = auVar73._8_4_;
    auVar272._8_4_ = auVar237._8_4_ * fVar127;
    fVar128 = auVar73._12_4_;
    auVar272._12_4_ = auVar237._12_4_ * fVar128;
    auVar272._16_4_ = auVar237._16_4_ * 0.0;
    auVar272._20_4_ = auVar237._20_4_ * 0.0;
    auVar272._28_36_ = auVar244._28_36_;
    auVar272._24_4_ = auVar237._24_4_ * 0.0;
    auVar244._0_4_ = auVar251._0_4_ * fVar96;
    auVar244._4_4_ = auVar251._4_4_ * fVar126;
    auVar244._8_4_ = auVar251._8_4_ * fVar127;
    auVar244._12_4_ = auVar251._12_4_ * fVar128;
    auVar244._16_4_ = auVar251._16_4_ * 0.0;
    auVar244._20_4_ = auVar251._20_4_ * 0.0;
    auVar244._28_36_ = auVar226._28_36_;
    auVar244._24_4_ = auVar251._24_4_ * 0.0;
    auVar226._0_4_ = auVar261._0_4_ * fVar96;
    auVar226._4_4_ = auVar261._4_4_ * fVar126;
    auVar226._8_4_ = auVar261._8_4_ * fVar127;
    auVar226._12_4_ = auVar261._12_4_ * fVar128;
    auVar226._16_4_ = auVar261._16_4_ * 0.0;
    auVar226._20_4_ = auVar261._20_4_ * 0.0;
    auVar226._28_36_ = auVar234._28_36_;
    auVar226._24_4_ = auVar261._24_4_ * 0.0;
    fVar130 = auVar5._0_4_;
    fVar198 = auVar5._4_4_;
    auVar11._4_4_ = fVar198 * fVar126;
    auVar11._0_4_ = fVar130 * fVar96;
    auVar11._8_4_ = fVar130 * fVar127;
    auVar11._12_4_ = fVar198 * fVar128;
    auVar11._16_4_ = fVar130 * 0.0;
    auVar11._20_4_ = fVar198 * 0.0;
    auVar11._24_4_ = fVar130 * 0.0;
    auVar11._28_4_ = fVar129;
    auVar73 = vfmadd231ps_fma(auVar272._0_32_,auVar114,local_3a0);
    auVar132 = vfmadd231ps_fma(auVar244._0_32_,auVar114,auVar144);
    auVar98 = vfmadd231ps_fma(auVar226._0_32_,auVar114,auVar203);
    auVar72 = vfmadd231ps_fma(auVar11,auVar114,local_380);
    auVar145._4_4_ = fStack_27c;
    auVar145._0_4_ = local_280;
    auVar145._8_4_ = fStack_278;
    auVar145._12_4_ = fStack_274;
    auVar145._16_4_ = fStack_270;
    auVar145._20_4_ = fStack_26c;
    auVar145._24_4_ = fStack_268;
    auVar145._28_4_ = fStack_264;
    auVar87._4_4_ = fStack_27c * fVar126;
    auVar87._0_4_ = local_280 * fVar96;
    auVar87._8_4_ = fStack_278 * fVar127;
    auVar87._12_4_ = fStack_274 * fVar128;
    auVar87._16_4_ = fStack_270 * 0.0;
    auVar87._20_4_ = fStack_26c * 0.0;
    auVar87._24_4_ = fStack_268 * 0.0;
    auVar87._28_4_ = local_380._28_4_;
    auVar12._4_4_ = fVar126 * fStack_4dc;
    auVar12._0_4_ = fVar96 * local_4e0;
    auVar12._8_4_ = fVar127 * fStack_4d8;
    auVar12._12_4_ = fVar128 * fStack_4d4;
    auVar12._16_4_ = fStack_4d0 * 0.0;
    auVar12._20_4_ = fStack_4cc * 0.0;
    auVar12._24_4_ = fStack_4c8 * 0.0;
    auVar12._28_4_ = local_3a0._28_4_;
    auVar55._8_8_ = uStack_1d8;
    auVar55._0_8_ = local_1e0;
    auVar55._16_8_ = uStack_1d0;
    auVar55._24_8_ = uStack_1c8;
    auVar182._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar126;
    auVar182._0_4_ = (float)local_1e0 * fVar96;
    auVar182._8_4_ = (float)uStack_1d8 * fVar127;
    auVar182._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar128;
    auVar182._16_4_ = (float)uStack_1d0 * 0.0;
    auVar182._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar182._24_4_ = (float)uStack_1c8 * 0.0;
    auVar182._28_4_ = 0x3f800000;
    auVar56._4_4_ = fVar126 * fStack_4fc;
    auVar56._0_4_ = fVar96 * local_500;
    auVar56._8_4_ = fVar127 * fStack_4f8;
    auVar56._12_4_ = fVar128 * fStack_4f4;
    auVar56._16_4_ = fStack_4f0 * 0.0;
    auVar56._20_4_ = fStack_4ec * 0.0;
    auVar56._24_4_ = fStack_4e8 * 0.0;
    auVar56._28_4_ = DAT_01f7b040._28_4_;
    auVar99 = vfmadd231ps_fma(auVar87,auVar114,auVar237);
    auVar154 = vfmadd231ps_fma(auVar12,auVar114,auVar251._0_32_);
    auVar77 = vfmadd231ps_fma(auVar182,auVar114,auVar261._0_32_);
    auVar71 = vfmadd231ps_fma(auVar56,auVar114,auVar266);
    auVar262._0_4_ = fVar96 * local_2a0;
    auVar262._4_4_ = fVar126 * fStack_29c;
    auVar262._8_4_ = fVar127 * fStack_298;
    auVar262._12_4_ = fVar128 * fStack_294;
    auVar262._16_4_ = fStack_290 * 0.0;
    auVar262._20_4_ = fStack_28c * 0.0;
    auVar262._28_36_ = auVar261._28_36_;
    auVar262._24_4_ = fStack_288 * 0.0;
    auVar234._0_4_ = fVar96 * (float)local_200;
    auVar234._4_4_ = fVar126 * local_200._4_4_;
    auVar234._8_4_ = fVar127 * (float)uStack_1f8;
    auVar234._12_4_ = fVar128 * uStack_1f8._4_4_;
    auVar234._16_4_ = (float)uStack_1f0 * 0.0;
    auVar234._20_4_ = uStack_1f0._4_4_ * 0.0;
    auVar234._28_36_ = auVar251._28_36_;
    auVar234._24_4_ = (float)uStack_1e8 * 0.0;
    auVar167._28_4_ = auVar203._28_4_;
    auVar167._0_28_ =
         ZEXT1628(CONCAT412(auVar99._12_4_ * fVar128,
                            CONCAT48(auVar99._8_4_ * fVar127,
                                     CONCAT44(auVar99._4_4_ * fVar126,auVar99._0_4_ * fVar96))));
    auVar73 = vfmadd231ps_fma(auVar167,auVar114,ZEXT1632(auVar73));
    auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar154._12_4_,
                                                  CONCAT48(fVar127 * auVar154._8_4_,
                                                           CONCAT44(fVar126 * auVar154._4_4_,
                                                                    fVar96 * auVar154._0_4_)))),
                               auVar114,ZEXT1632(auVar132));
    auVar166._28_4_ = auVar237._28_4_;
    auVar166._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar77._12_4_,
                            CONCAT48(fVar127 * auVar77._8_4_,
                                     CONCAT44(fVar126 * auVar77._4_4_,fVar96 * auVar77._0_4_))));
    auVar98 = vfmadd231ps_fma(auVar166,auVar114,ZEXT1632(auVar98));
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar71._12_4_,
                                                 CONCAT48(fVar127 * auVar71._8_4_,
                                                          CONCAT44(fVar126 * auVar71._4_4_,
                                                                   fVar96 * auVar71._0_4_)))),
                              auVar114,ZEXT1632(auVar72));
    auVar217._0_4_ = fVar96 * (float)local_220;
    auVar217._4_4_ = fVar126 * local_220._4_4_;
    auVar217._8_4_ = fVar127 * (float)uStack_218;
    auVar217._12_4_ = fVar128 * uStack_218._4_4_;
    auVar217._16_4_ = (float)uStack_210 * 0.0;
    auVar217._20_4_ = uStack_210._4_4_ * 0.0;
    auVar217._24_4_ = (float)uStack_208 * 0.0;
    auVar217._28_4_ = 0;
    auVar97 = vfmadd231ps_fma(auVar262._0_32_,auVar114,auVar145);
    auVar99 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar97._12_4_ * fVar128,
                                                 CONCAT48(auVar97._8_4_ * fVar127,
                                                          CONCAT44(auVar97._4_4_ * fVar126,
                                                                   auVar97._0_4_ * fVar96)))),
                              auVar114,ZEXT1632(auVar99));
    auVar228._0_4_ = fVar96 * (float)local_240;
    auVar228._4_4_ = fVar126 * local_240._4_4_;
    auVar228._8_4_ = fVar127 * (float)uStack_238;
    auVar228._12_4_ = fVar128 * uStack_238._4_4_;
    auVar228._16_4_ = (float)uStack_230 * 0.0;
    auVar228._20_4_ = uStack_230._4_4_ * 0.0;
    auVar228._24_4_ = (float)uStack_228 * 0.0;
    auVar228._28_4_ = 0;
    auVar84._4_4_ = fStack_4dc;
    auVar84._0_4_ = local_4e0;
    auVar84._8_4_ = fStack_4d8;
    auVar84._12_4_ = fStack_4d4;
    auVar84._16_4_ = fStack_4d0;
    auVar84._20_4_ = fStack_4cc;
    auVar84._24_4_ = fStack_4c8;
    auVar84._28_4_ = fStack_4c4;
    auVar97 = vfmadd231ps_fma(auVar234._0_32_,auVar114,auVar84);
    auVar173 = vfmadd231ps_fma(auVar217,auVar114,auVar55);
    auVar206._4_4_ = fStack_4fc;
    auVar206._0_4_ = local_500;
    auVar206._8_4_ = fStack_4f8;
    auVar206._12_4_ = fStack_4f4;
    auVar206._16_4_ = fStack_4f0;
    auVar206._20_4_ = fStack_4ec;
    auVar206._24_4_ = fStack_4e8;
    auVar206._28_4_ = fStack_4e4;
    auVar134 = vfmadd231ps_fma(auVar228,auVar114,auVar206);
    auVar57._28_4_ = fVar198;
    auVar57._0_28_ =
         ZEXT1628(CONCAT412(auVar134._12_4_ * fVar128,
                            CONCAT48(auVar134._8_4_ * fVar127,
                                     CONCAT44(auVar134._4_4_ * fVar126,auVar134._0_4_ * fVar96))));
    auVar154 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar97._12_4_ * fVar128,
                                                  CONCAT48(auVar97._8_4_ * fVar127,
                                                           CONCAT44(auVar97._4_4_ * fVar126,
                                                                    auVar97._0_4_ * fVar96)))),
                               auVar114,ZEXT1632(auVar154));
    auVar77 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar128 * auVar173._12_4_,
                                                 CONCAT48(fVar127 * auVar173._8_4_,
                                                          CONCAT44(fVar126 * auVar173._4_4_,
                                                                   fVar96 * auVar173._0_4_)))),
                              auVar114,ZEXT1632(auVar77));
    auVar71 = vfmadd231ps_fma(auVar57,auVar114,ZEXT1632(auVar71));
    auVar13._28_4_ = fStack_264;
    auVar13._0_28_ =
         ZEXT1628(CONCAT412(fVar128 * auVar77._12_4_,
                            CONCAT48(fVar127 * auVar77._8_4_,
                                     CONCAT44(fVar126 * auVar77._4_4_,fVar96 * auVar77._0_4_))));
    auVar97 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * fVar128,
                                                 CONCAT48(auVar99._8_4_ * fVar127,
                                                          CONCAT44(auVar99._4_4_ * fVar126,
                                                                   auVar99._0_4_ * fVar96)))),
                              auVar114,ZEXT1632(auVar73));
    auVar173 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar154._12_4_ * fVar128,
                                                  CONCAT48(auVar154._8_4_ * fVar127,
                                                           CONCAT44(auVar154._4_4_ * fVar126,
                                                                    auVar154._0_4_ * fVar96)))),
                               auVar114,ZEXT1632(auVar132));
    auVar134 = vfmadd231ps_fma(auVar13,auVar114,ZEXT1632(auVar98));
    auVar184 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar128,
                                                  CONCAT48(auVar71._8_4_ * fVar127,
                                                           CONCAT44(auVar71._4_4_ * fVar126,
                                                                    auVar71._0_4_ * fVar96)))),
                               ZEXT1632(auVar72),auVar114);
    auVar145 = ZEXT1632(auVar184);
    auVar203 = vsubps_avx(ZEXT1632(auVar99),ZEXT1632(auVar73));
    auVar114 = vsubps_avx(ZEXT1632(auVar154),ZEXT1632(auVar132));
    auVar237 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar98));
    auVar144 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar72));
    fVar198 = fVar131 * auVar203._0_4_ * 3.0;
    fVar207 = fVar131 * auVar203._4_4_ * 3.0;
    local_980._4_4_ = fVar207;
    local_980._0_4_ = fVar198;
    fVar208 = fVar131 * auVar203._8_4_ * 3.0;
    local_980._8_4_ = fVar208;
    fVar209 = fVar131 * auVar203._12_4_ * 3.0;
    local_980._12_4_ = fVar209;
    fVar210 = fVar131 * auVar203._16_4_ * 3.0;
    local_980._16_4_ = fVar210;
    fVar211 = fVar131 * auVar203._20_4_ * 3.0;
    local_980._20_4_ = fVar211;
    fVar212 = fVar131 * auVar203._24_4_ * 3.0;
    local_980._24_4_ = fVar212;
    local_980._28_4_ = auVar237._28_4_;
    local_9c0._0_4_ = fVar131 * auVar114._0_4_ * 3.0;
    local_9c0._4_4_ = fVar131 * auVar114._4_4_ * 3.0;
    local_9c0._8_4_ = fVar131 * auVar114._8_4_ * 3.0;
    local_9c0._12_4_ = fVar131 * auVar114._12_4_ * 3.0;
    local_9c0._16_4_ = fVar131 * auVar114._16_4_ * 3.0;
    local_9c0._20_4_ = fVar131 * auVar114._20_4_ * 3.0;
    local_9c0._24_4_ = fVar131 * auVar114._24_4_ * 3.0;
    local_9c0._28_4_ = 0;
    auVar238._0_4_ = fVar131 * auVar237._0_4_ * 3.0;
    auVar238._4_4_ = fVar131 * auVar237._4_4_ * 3.0;
    auVar238._8_4_ = fVar131 * auVar237._8_4_ * 3.0;
    auVar238._12_4_ = fVar131 * auVar237._12_4_ * 3.0;
    auVar238._16_4_ = fVar131 * auVar237._16_4_ * 3.0;
    auVar238._20_4_ = fVar131 * auVar237._20_4_ * 3.0;
    auVar238._24_4_ = fVar131 * auVar237._24_4_ * 3.0;
    auVar238._28_4_ = 0;
    fVar96 = fVar131 * auVar144._0_4_ * 3.0;
    fVar126 = fVar131 * auVar144._4_4_ * 3.0;
    auVar14._4_4_ = fVar126;
    auVar14._0_4_ = fVar96;
    fVar127 = fVar131 * auVar144._8_4_ * 3.0;
    auVar14._8_4_ = fVar127;
    fVar128 = fVar131 * auVar144._12_4_ * 3.0;
    auVar14._12_4_ = fVar128;
    fVar129 = fVar131 * auVar144._16_4_ * 3.0;
    auVar14._16_4_ = fVar129;
    fVar130 = fVar131 * auVar144._20_4_ * 3.0;
    auVar14._20_4_ = fVar130;
    fVar131 = fVar131 * auVar144._24_4_ * 3.0;
    auVar14._24_4_ = fVar131;
    auVar14._28_4_ = auVar203._28_4_;
    local_920 = ZEXT1632(auVar97);
    auVar166 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar97));
    auVar13 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar173));
    auVar84 = ZEXT1632(auVar134);
    auVar206 = vpermps_avx2(_DAT_01fb7720,auVar84);
    local_2e0 = vsubps_avx(auVar166,local_920);
    local_2c0 = vsubps_avx(auVar206,ZEXT1632(auVar134));
    fVar172 = local_2c0._0_4_;
    fVar151 = local_2c0._4_4_;
    auVar15._4_4_ = fVar151 * fVar207;
    auVar15._0_4_ = fVar172 * fVar198;
    fVar198 = local_2c0._8_4_;
    auVar15._8_4_ = fVar198 * fVar208;
    fVar152 = local_2c0._12_4_;
    auVar15._12_4_ = fVar152 * fVar209;
    fVar153 = local_2c0._16_4_;
    auVar15._16_4_ = fVar153 * fVar210;
    fVar240 = local_2c0._20_4_;
    auVar15._20_4_ = fVar240 * fVar211;
    fVar245 = local_2c0._24_4_;
    auVar15._24_4_ = fVar245 * fVar212;
    auVar15._28_4_ = auVar206._28_4_;
    auVar73 = vfmsub231ps_fma(auVar15,auVar238,local_2e0);
    local_300 = vsubps_avx(auVar13,ZEXT1632(auVar173));
    fVar246 = local_2e0._0_4_;
    fVar247 = local_2e0._4_4_;
    auVar229._4_4_ = fVar247 * local_9c0._4_4_;
    auVar229._0_4_ = fVar246 * (float)local_9c0._0_4_;
    fVar252 = local_2e0._8_4_;
    auVar229._8_4_ = fVar252 * local_9c0._8_4_;
    fVar253 = local_2e0._12_4_;
    auVar229._12_4_ = fVar253 * local_9c0._12_4_;
    fVar254 = local_2e0._16_4_;
    auVar229._16_4_ = fVar254 * local_9c0._16_4_;
    fVar255 = local_2e0._20_4_;
    auVar229._20_4_ = fVar255 * local_9c0._20_4_;
    fVar256 = local_2e0._24_4_;
    auVar229._24_4_ = fVar256 * local_9c0._24_4_;
    auVar229._28_4_ = auVar166._28_4_;
    auVar132 = vfmsub231ps_fma(auVar229,local_980,local_300);
    auVar73 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar132._12_4_ * auVar132._12_4_,
                                                 CONCAT48(auVar132._8_4_ * auVar132._8_4_,
                                                          CONCAT44(auVar132._4_4_ * auVar132._4_4_,
                                                                   auVar132._0_4_ * auVar132._0_4_))
                                                )),ZEXT1632(auVar73),ZEXT1632(auVar73));
    auVar165._0_4_ = fVar172 * fVar172;
    auVar165._4_4_ = fVar151 * fVar151;
    auVar165._8_4_ = fVar198 * fVar198;
    auVar165._12_4_ = fVar152 * fVar152;
    auVar165._16_4_ = fVar153 * fVar153;
    auVar165._20_4_ = fVar240 * fVar240;
    auVar165._24_4_ = fVar245 * fVar245;
    auVar165._28_4_ = 0;
    auVar132 = vfmadd231ps_fma(auVar165,local_300,local_300);
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),local_2e0,local_2e0);
    fVar207 = local_300._0_4_;
    fVar208 = local_300._4_4_;
    auVar241._4_4_ = fVar208 * auVar238._4_4_;
    auVar241._0_4_ = fVar207 * auVar238._0_4_;
    fVar209 = local_300._8_4_;
    auVar241._8_4_ = fVar209 * auVar238._8_4_;
    fVar210 = local_300._12_4_;
    auVar241._12_4_ = fVar210 * auVar238._12_4_;
    fVar211 = local_300._16_4_;
    auVar241._16_4_ = fVar211 * auVar238._16_4_;
    fVar212 = local_300._20_4_;
    auVar241._20_4_ = fVar212 * auVar238._20_4_;
    fVar263 = local_300._24_4_;
    auVar241._24_4_ = fVar263 * auVar238._24_4_;
    auVar241._28_4_ = auVar13._28_4_;
    auVar114 = vrcpps_avx(ZEXT1632(auVar132));
    auVar98 = vfmsub231ps_fma(auVar241,local_9c0,local_2c0);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar73),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar85._8_4_ = 0x3f800000;
    auVar85._0_8_ = 0x3f8000003f800000;
    auVar85._12_4_ = 0x3f800000;
    auVar85._16_4_ = 0x3f800000;
    auVar85._20_4_ = 0x3f800000;
    auVar85._24_4_ = 0x3f800000;
    auVar85._28_4_ = 0x3f800000;
    auVar73 = vfnmadd213ps_fma(auVar114,ZEXT1632(auVar132),auVar85);
    auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar114,auVar114);
    local_9e0 = vpermps_avx2(_DAT_01fb7720,local_980);
    local_a00 = vpermps_avx2(_DAT_01fb7720,auVar238);
    auVar258._4_4_ = fVar151 * local_9e0._4_4_;
    auVar258._0_4_ = fVar172 * local_9e0._0_4_;
    auVar258._8_4_ = fVar198 * local_9e0._8_4_;
    auVar258._12_4_ = fVar152 * local_9e0._12_4_;
    auVar258._16_4_ = fVar153 * local_9e0._16_4_;
    auVar258._20_4_ = fVar240 * local_9e0._20_4_;
    auVar258._24_4_ = fVar245 * local_9e0._24_4_;
    auVar258._28_4_ = auVar114._28_4_;
    auVar72 = vfmsub231ps_fma(auVar258,local_a00,local_2e0);
    local_740 = vpermps_avx2(_DAT_01fb7720,local_9c0);
    auVar271._4_4_ = fVar247 * local_740._4_4_;
    auVar271._0_4_ = fVar246 * local_740._0_4_;
    auVar271._8_4_ = fVar252 * local_740._8_4_;
    auVar271._12_4_ = fVar253 * local_740._12_4_;
    auVar271._16_4_ = fVar254 * local_740._16_4_;
    auVar271._20_4_ = fVar255 * local_740._20_4_;
    auVar271._24_4_ = fVar256 * local_740._24_4_;
    auVar271._28_4_ = auVar237._28_4_;
    auVar99 = vfmsub231ps_fma(auVar271,local_9e0,local_300);
    auVar72 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar99._12_4_ * auVar99._12_4_,
                                                 CONCAT48(auVar99._8_4_ * auVar99._8_4_,
                                                          CONCAT44(auVar99._4_4_ * auVar99._4_4_,
                                                                   auVar99._0_4_ * auVar99._0_4_))))
                              ,ZEXT1632(auVar72),ZEXT1632(auVar72));
    auVar193._0_4_ = fVar207 * local_a00._0_4_;
    auVar193._4_4_ = fVar208 * local_a00._4_4_;
    auVar193._8_4_ = fVar209 * local_a00._8_4_;
    auVar193._12_4_ = fVar210 * local_a00._12_4_;
    auVar193._16_4_ = fVar211 * local_a00._16_4_;
    auVar193._20_4_ = fVar212 * local_a00._20_4_;
    auVar193._24_4_ = fVar263 * local_a00._24_4_;
    auVar193._28_4_ = 0;
    auVar99 = vfmsub231ps_fma(auVar193,local_740,local_2c0);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),ZEXT1632(auVar99),ZEXT1632(auVar99));
    auVar114 = vmaxps_avx(ZEXT1632(CONCAT412(auVar98._12_4_ * auVar73._12_4_,
                                             CONCAT48(auVar98._8_4_ * auVar73._8_4_,
                                                      CONCAT44(auVar98._4_4_ * auVar73._4_4_,
                                                               auVar98._0_4_ * auVar73._0_4_)))),
                          ZEXT1632(CONCAT412(auVar72._12_4_ * auVar73._12_4_,
                                             CONCAT48(auVar72._8_4_ * auVar73._8_4_,
                                                      CONCAT44(auVar72._4_4_ * auVar73._4_4_,
                                                               auVar72._0_4_ * auVar73._0_4_)))));
    local_7a0._0_4_ = auVar184._0_4_ + fVar96;
    local_7a0._4_4_ = auVar184._4_4_ + fVar126;
    local_7a0._8_4_ = auVar184._8_4_ + fVar127;
    local_7a0._12_4_ = auVar184._12_4_ + fVar128;
    local_7a0._16_4_ = fVar129 + 0.0;
    local_7a0._20_4_ = fVar130 + 0.0;
    local_7a0._24_4_ = fVar131 + 0.0;
    local_7a0._28_4_ = auVar203._28_4_ + 0.0;
    auVar203 = vsubps_avx(auVar145,auVar14);
    auVar14 = vpermps_avx2(_DAT_01fb7720,auVar203);
    auVar15 = vpermps_avx2(_DAT_01fb7720,auVar145);
    auVar203 = vmaxps_avx(auVar145,local_7a0);
    auVar144 = vrsqrtps_avx(ZEXT1632(auVar132));
    auVar237 = vmaxps_avx(auVar14,auVar15);
    auVar203 = vmaxps_avx(auVar203,auVar237);
    fVar96 = auVar144._0_4_;
    fVar126 = auVar144._4_4_;
    fVar127 = auVar144._8_4_;
    fVar128 = auVar144._12_4_;
    fVar131 = auVar144._16_4_;
    fVar129 = auVar144._20_4_;
    fVar130 = auVar144._24_4_;
    auVar10._4_4_ = fVar126 * fVar126 * fVar126 * auVar132._4_4_ * -0.5;
    auVar10._0_4_ = fVar96 * fVar96 * fVar96 * auVar132._0_4_ * -0.5;
    auVar10._8_4_ = fVar127 * fVar127 * fVar127 * auVar132._8_4_ * -0.5;
    auVar10._12_4_ = fVar128 * fVar128 * fVar128 * auVar132._12_4_ * -0.5;
    auVar10._16_4_ = fVar131 * fVar131 * fVar131 * -0.0;
    auVar10._20_4_ = fVar129 * fVar129 * fVar129 * -0.0;
    auVar10._24_4_ = fVar130 * fVar130 * fVar130 * -0.0;
    auVar10._28_4_ = local_740._28_4_;
    auVar115._8_4_ = 0x3fc00000;
    auVar115._0_8_ = 0x3fc000003fc00000;
    auVar115._12_4_ = 0x3fc00000;
    auVar115._16_4_ = 0x3fc00000;
    auVar115._20_4_ = 0x3fc00000;
    auVar115._24_4_ = 0x3fc00000;
    auVar115._28_4_ = 0x3fc00000;
    auVar73 = vfmadd231ps_fma(auVar10,auVar115,auVar144);
    fVar126 = auVar73._0_4_;
    fVar127 = auVar73._4_4_;
    auVar17._4_4_ = fVar208 * fVar127;
    auVar17._0_4_ = fVar207 * fVar126;
    fVar131 = auVar73._8_4_;
    auVar17._8_4_ = fVar209 * fVar131;
    fVar130 = auVar73._12_4_;
    auVar17._12_4_ = fVar210 * fVar130;
    auVar17._16_4_ = fVar211 * 0.0;
    auVar17._20_4_ = fVar212 * 0.0;
    auVar17._24_4_ = fVar263 * 0.0;
    auVar17._28_4_ = 0;
    auVar18._4_4_ = (float)local_7e0._4_4_ * fVar151 * fVar127;
    auVar18._0_4_ = (float)local_7e0._0_4_ * fVar172 * fVar126;
    auVar18._8_4_ = fStack_7d8 * fVar198 * fVar131;
    auVar18._12_4_ = fStack_7d4 * fVar152 * fVar130;
    auVar18._16_4_ = fStack_7d0 * fVar153 * 0.0;
    auVar18._20_4_ = fStack_7cc * fVar240 * 0.0;
    auVar18._24_4_ = fStack_7c8 * fVar245 * 0.0;
    auVar18._28_4_ = local_2c0._28_4_;
    auVar132 = vfmadd231ps_fma(auVar18,auVar17,_local_7c0);
    auVar144 = vsubps_avx(ZEXT832(0) << 0x20,auVar84);
    fVar207 = auVar144._0_4_;
    fVar208 = auVar144._4_4_;
    auVar19._4_4_ = fVar208 * fVar151 * fVar127;
    auVar19._0_4_ = fVar207 * fVar172 * fVar126;
    fVar209 = auVar144._8_4_;
    auVar19._8_4_ = fVar209 * fVar198 * fVar131;
    fVar210 = auVar144._12_4_;
    auVar19._12_4_ = fVar210 * fVar152 * fVar130;
    fVar211 = auVar144._16_4_;
    auVar19._16_4_ = fVar211 * fVar153 * 0.0;
    fVar212 = auVar144._20_4_;
    auVar19._20_4_ = fVar212 * fVar240 * 0.0;
    fVar172 = auVar144._24_4_;
    auVar19._24_4_ = fVar172 * fVar245 * 0.0;
    auVar19._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar229 = ZEXT1632(auVar173);
    auVar11 = vsubps_avx(ZEXT832(0) << 0x20,auVar229);
    auVar98 = vfmadd231ps_fma(auVar19,auVar11,auVar17);
    auVar20._4_4_ = fVar247 * fVar127;
    auVar20._0_4_ = fVar246 * fVar126;
    auVar20._8_4_ = fVar252 * fVar131;
    auVar20._12_4_ = fVar253 * fVar130;
    auVar20._16_4_ = fVar254 * 0.0;
    auVar20._20_4_ = fVar255 * 0.0;
    auVar20._24_4_ = fVar256 * 0.0;
    auVar20._28_4_ = auVar237._28_4_;
    auVar132 = vfmadd231ps_fma(ZEXT1632(auVar132),auVar20,_local_640);
    auVar244 = ZEXT1664(auVar132);
    auVar258 = ZEXT832(0) << 0x20;
    auVar87 = vsubps_avx(auVar258,local_920);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar87,auVar20);
    auVar21._4_4_ = (float)local_7e0._4_4_ * fVar208;
    auVar21._0_4_ = (float)local_7e0._0_4_ * fVar207;
    auVar21._8_4_ = fStack_7d8 * fVar209;
    auVar21._12_4_ = fStack_7d4 * fVar210;
    auVar21._16_4_ = fStack_7d0 * fVar211;
    auVar21._20_4_ = fStack_7cc * fVar212;
    auVar21._24_4_ = fStack_7c8 * fVar172;
    auVar21._28_4_ = auVar237._28_4_;
    auVar72 = vfmadd231ps_fma(auVar21,_local_7c0,auVar11);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),_local_640,auVar87);
    fVar96 = auVar98._0_4_;
    fVar240 = auVar132._0_4_;
    fVar128 = auVar98._4_4_;
    fVar245 = auVar132._4_4_;
    fVar129 = auVar98._8_4_;
    fVar246 = auVar132._8_4_;
    fVar198 = auVar98._12_4_;
    fVar247 = auVar132._12_4_;
    auVar22._28_4_ = uStack_7c4;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * fVar198,
                            CONCAT48(fVar246 * fVar129,CONCAT44(fVar245 * fVar128,fVar240 * fVar96))
                           ));
    auVar12 = vsubps_avx(ZEXT1632(auVar72),auVar22);
    auVar23._4_4_ = fVar208 * fVar208;
    auVar23._0_4_ = fVar207 * fVar207;
    auVar23._8_4_ = fVar209 * fVar209;
    auVar23._12_4_ = fVar210 * fVar210;
    auVar23._16_4_ = fVar211 * fVar211;
    auVar23._20_4_ = fVar212 * fVar212;
    auVar23._24_4_ = fVar172 * fVar172;
    auVar23._28_4_ = uStack_7c4;
    auVar72 = vfmadd231ps_fma(auVar23,auVar11,auVar11);
    auVar72 = vfmadd231ps_fma(ZEXT1632(auVar72),auVar87,auVar87);
    auVar24._28_4_ = local_2e0._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar198 * fVar198,
                            CONCAT48(fVar129 * fVar129,CONCAT44(fVar128 * fVar128,fVar96 * fVar96)))
                 );
    auVar182 = vsubps_avx(ZEXT1632(auVar72),auVar24);
    auVar237 = vsqrtps_avx(auVar114);
    fVar96 = (auVar203._0_4_ + auVar237._0_4_) * 1.0000002;
    fVar128 = (auVar203._4_4_ + auVar237._4_4_) * 1.0000002;
    fVar129 = (auVar203._8_4_ + auVar237._8_4_) * 1.0000002;
    fVar198 = (auVar203._12_4_ + auVar237._12_4_) * 1.0000002;
    fVar151 = (auVar203._16_4_ + auVar237._16_4_) * 1.0000002;
    fVar152 = (auVar203._20_4_ + auVar237._20_4_) * 1.0000002;
    fVar153 = (auVar203._24_4_ + auVar237._24_4_) * 1.0000002;
    auVar25._4_4_ = fVar128 * fVar128;
    auVar25._0_4_ = fVar96 * fVar96;
    auVar25._8_4_ = fVar129 * fVar129;
    auVar25._12_4_ = fVar198 * fVar198;
    auVar25._16_4_ = fVar151 * fVar151;
    auVar25._20_4_ = fVar152 * fVar152;
    auVar25._24_4_ = fVar153 * fVar153;
    auVar25._28_4_ = auVar203._28_4_ + auVar237._28_4_;
    fVar128 = auVar12._0_4_ + auVar12._0_4_;
    fVar129 = auVar12._4_4_ + auVar12._4_4_;
    local_340._0_8_ = CONCAT44(fVar129,fVar128);
    local_340._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    local_340._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    local_340._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    local_340._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    local_340._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    fVar96 = auVar12._28_4_;
    local_340._28_4_ = fVar96 + fVar96;
    auVar203 = vsubps_avx(auVar182,auVar25);
    auVar241 = ZEXT1632(auVar132);
    local_320._28_4_ = auVar182._28_4_;
    local_320._0_28_ =
         ZEXT1628(CONCAT412(fVar247 * fVar247,
                            CONCAT48(fVar246 * fVar246,CONCAT44(fVar245 * fVar245,fVar240 * fVar240)
                                    )));
    auVar12 = vsubps_avx(local_260,local_320);
    auVar26._4_4_ = fVar129 * fVar129;
    auVar26._0_4_ = fVar128 * fVar128;
    auVar26._8_4_ = local_340._8_4_ * local_340._8_4_;
    auVar26._12_4_ = local_340._12_4_ * local_340._12_4_;
    auVar26._16_4_ = local_340._16_4_ * local_340._16_4_;
    auVar26._20_4_ = local_340._20_4_ * local_340._20_4_;
    auVar26._24_4_ = local_340._24_4_ * local_340._24_4_;
    auVar26._28_4_ = fVar96;
    fVar96 = auVar12._0_4_;
    fVar128 = auVar12._4_4_;
    fVar129 = auVar12._8_4_;
    fVar198 = auVar12._12_4_;
    fVar151 = auVar12._16_4_;
    fVar152 = auVar12._20_4_;
    fVar153 = auVar12._24_4_;
    auVar27._4_4_ = fVar128 * 4.0 * auVar203._4_4_;
    auVar27._0_4_ = fVar96 * 4.0 * auVar203._0_4_;
    auVar27._8_4_ = fVar129 * 4.0 * auVar203._8_4_;
    auVar27._12_4_ = fVar198 * 4.0 * auVar203._12_4_;
    auVar27._16_4_ = fVar151 * 4.0 * auVar203._16_4_;
    auVar27._20_4_ = fVar152 * 4.0 * auVar203._20_4_;
    auVar27._24_4_ = fVar153 * 4.0 * auVar203._24_4_;
    auVar27._28_4_ = 0x40800000;
    auVar167 = vsubps_avx(auVar26,auVar27);
    auVar114 = vcmpps_avx(auVar167,auVar258,5);
    local_360._0_4_ = fVar96 + fVar96;
    local_360._4_4_ = fVar128 + fVar128;
    local_360._8_4_ = fVar129 + fVar129;
    local_360._12_4_ = fVar198 + fVar198;
    local_360._16_4_ = fVar151 + fVar151;
    local_360._20_4_ = fVar152 + fVar152;
    local_360._24_4_ = fVar153 + fVar153;
    local_360._28_4_ = auVar12._28_4_ + auVar12._28_4_;
    auVar271 = ZEXT1632(auVar98);
    if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0x7f,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar114 >> 0xbf,0) == '\0') &&
        (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar114[0x1f])
    {
      auVar218._8_4_ = 0x7f800000;
      auVar218._0_8_ = 0x7f8000007f800000;
      auVar218._12_4_ = 0x7f800000;
      auVar218._16_4_ = 0x7f800000;
      auVar218._20_4_ = 0x7f800000;
      auVar218._24_4_ = 0x7f800000;
      auVar218._28_4_ = 0x7f800000;
      auVar86._8_4_ = 0xff800000;
      auVar86._0_8_ = 0xff800000ff800000;
      auVar86._12_4_ = 0xff800000;
      auVar86._16_4_ = 0xff800000;
      auVar86._20_4_ = 0xff800000;
      auVar86._24_4_ = 0xff800000;
      auVar86._28_4_ = 0xff800000;
    }
    else {
      auVar10 = vsqrtps_avx(auVar167);
      auVar258 = vcmpps_avx(auVar167,auVar258,5);
      auVar167 = vrcpps_avx(local_360);
      auVar219._8_4_ = 0x3f800000;
      auVar219._0_8_ = 0x3f8000003f800000;
      auVar219._12_4_ = 0x3f800000;
      auVar219._16_4_ = 0x3f800000;
      auVar219._20_4_ = 0x3f800000;
      auVar219._24_4_ = 0x3f800000;
      auVar219._28_4_ = 0x3f800000;
      auVar132 = vfnmadd213ps_fma(auVar167,local_360,auVar219);
      auVar132 = vfmadd132ps_fma(ZEXT1632(auVar132),auVar167,auVar167);
      auVar267._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
      auVar267._8_4_ = -local_340._8_4_;
      auVar267._12_4_ = -local_340._12_4_;
      auVar267._16_4_ = -local_340._16_4_;
      auVar267._20_4_ = -local_340._20_4_;
      auVar267._24_4_ = -local_340._24_4_;
      auVar267._28_4_ = -local_340._28_4_;
      auVar167 = vsubps_avx(auVar267,auVar10);
      auVar28._4_4_ = auVar167._4_4_ * auVar132._4_4_;
      auVar28._0_4_ = auVar167._0_4_ * auVar132._0_4_;
      auVar28._8_4_ = auVar167._8_4_ * auVar132._8_4_;
      auVar28._12_4_ = auVar167._12_4_ * auVar132._12_4_;
      auVar28._16_4_ = auVar167._16_4_ * 0.0;
      auVar28._20_4_ = auVar167._20_4_ * 0.0;
      auVar28._24_4_ = auVar167._24_4_ * 0.0;
      auVar28._28_4_ = auVar167._28_4_;
      auVar167 = vsubps_avx(auVar10,local_340);
      auVar250._0_4_ = auVar132._0_4_ * auVar167._0_4_;
      auVar250._4_4_ = auVar132._4_4_ * auVar167._4_4_;
      auVar250._8_4_ = auVar132._8_4_ * auVar167._8_4_;
      auVar250._12_4_ = auVar132._12_4_ * auVar167._12_4_;
      auVar250._16_4_ = auVar167._16_4_ * 0.0;
      auVar250._20_4_ = auVar167._20_4_ * 0.0;
      auVar250._24_4_ = auVar167._24_4_ * 0.0;
      auVar250._28_4_ = 0;
      auVar132 = vfmadd213ps_fma(auVar241,auVar28,auVar271);
      local_3e0 = fVar126 * auVar132._0_4_;
      fStack_3dc = fVar127 * auVar132._4_4_;
      fStack_3d8 = fVar131 * auVar132._8_4_;
      fStack_3d4 = fVar130 * auVar132._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      uStack_3c4 = 0x80000000;
      auVar167 = vandps_avx(local_800,local_320);
      auVar167 = vmaxps_avx(local_580,auVar167);
      auVar29._4_4_ = auVar167._4_4_ * 1.9073486e-06;
      auVar29._0_4_ = auVar167._0_4_ * 1.9073486e-06;
      auVar29._8_4_ = auVar167._8_4_ * 1.9073486e-06;
      auVar29._12_4_ = auVar167._12_4_ * 1.9073486e-06;
      auVar29._16_4_ = auVar167._16_4_ * 1.9073486e-06;
      auVar29._20_4_ = auVar167._20_4_ * 1.9073486e-06;
      auVar29._24_4_ = auVar167._24_4_ * 1.9073486e-06;
      auVar29._28_4_ = auVar167._28_4_;
      auVar167 = vandps_avx(auVar12,local_800);
      auVar167 = vcmpps_avx(auVar167,auVar29,1);
      auVar132 = vfmadd213ps_fma(auVar241,auVar250,auVar271);
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar218 = vblendvps_avx(auVar220,auVar28,auVar258);
      local_400 = fVar126 * auVar132._0_4_;
      fStack_3fc = fVar127 * auVar132._4_4_;
      fStack_3f8 = fVar131 * auVar132._8_4_;
      fStack_3f4 = fVar130 * auVar132._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      uStack_3e4 = 0x80000000;
      auVar259._8_4_ = 0xff800000;
      auVar259._0_8_ = 0xff800000ff800000;
      auVar259._12_4_ = 0xff800000;
      auVar259._16_4_ = 0xff800000;
      auVar259._20_4_ = 0xff800000;
      auVar259._24_4_ = 0xff800000;
      auVar259._28_4_ = 0xff800000;
      auVar86 = vblendvps_avx(auVar259,auVar250,auVar258);
      auVar10 = auVar258 & auVar167;
      if ((((((((auVar10 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar10 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar10 >> 0x7f,0) != '\0') ||
            (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar10 >> 0xbf,0) != '\0') ||
          (auVar10 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar10[0x1f] < '\0') {
        auVar114 = vandps_avx(auVar167,auVar258);
        auVar167 = vcmpps_avx(auVar203,_DAT_01f7b000,2);
        auVar269._8_4_ = 0xff800000;
        auVar269._0_8_ = 0xff800000ff800000;
        auVar269._12_4_ = 0xff800000;
        auVar269._16_4_ = 0xff800000;
        auVar269._20_4_ = 0xff800000;
        auVar269._24_4_ = 0xff800000;
        auVar269._28_4_ = 0xff800000;
        auVar225._8_4_ = 0x7f800000;
        auVar225._0_8_ = 0x7f8000007f800000;
        auVar225._12_4_ = 0x7f800000;
        auVar225._16_4_ = 0x7f800000;
        auVar225._20_4_ = 0x7f800000;
        auVar225._24_4_ = 0x7f800000;
        auVar225._28_4_ = 0x7f800000;
        auVar203 = vblendvps_avx(auVar225,auVar269,auVar167);
        auVar132 = vpackssdw_avx(auVar114._0_16_,auVar114._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar132);
        auVar218 = vblendvps_avx(auVar218,auVar203,auVar10);
        auVar203 = vblendvps_avx(auVar269,auVar225,auVar167);
        auVar86 = vblendvps_avx(auVar86,auVar203,auVar10);
        auVar149._0_8_ = auVar114._0_8_ ^ 0xffffffffffffffff;
        auVar149._8_4_ = auVar114._8_4_ ^ 0xffffffff;
        auVar149._12_4_ = auVar114._12_4_ ^ 0xffffffff;
        auVar149._16_4_ = auVar114._16_4_ ^ 0xffffffff;
        auVar149._20_4_ = auVar114._20_4_ ^ 0xffffffff;
        auVar149._24_4_ = auVar114._24_4_ ^ 0xffffffff;
        auVar149._28_4_ = auVar114._28_4_ ^ 0xffffffff;
        auVar114 = vorps_avx(auVar167,auVar149);
        auVar114 = vandps_avx(auVar258,auVar114);
      }
    }
    uStack_644 = 0x80000000;
    uStack_648 = 0x80000000;
    uStack_64c = 0x80000000;
    uStack_650 = 0x80000000;
    uStack_654 = 0x80000000;
    uStack_658 = 0x80000000;
    uStack_65c = 0x80000000;
    local_660 = 0x80000000;
    auVar234 = ZEXT1664(auVar73);
    auVar251 = ZEXT3264(CONCAT824(uStack_928,CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
    auVar203 = local_520 & auVar114;
    if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar203 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar203 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar203 >> 0x7f,0) == '\0') &&
          (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar203 >> 0xbf,0) == '\0') &&
        (auVar203 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar203[0x1f])
    {
LAB_01142419:
      auVar261 = ZEXT3264(local_900);
      auVar272 = ZEXT3264(local_9a0);
      fVar96 = (float)local_880._0_4_;
      fVar126 = (float)local_880._4_4_;
      fVar127 = fStack_878;
      fVar128 = fStack_874;
      fVar131 = fStack_870;
      fVar129 = fStack_86c;
      fVar130 = fStack_868;
      fVar198 = fStack_864;
    }
    else {
      local_420 = ZEXT1632(auVar73);
      auVar234 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar240 = *(float *)(ray + k * 4 + 0x80) - (float)local_8b0._0_4_;
      auVar194._4_4_ = fVar240;
      auVar194._0_4_ = fVar240;
      auVar194._8_4_ = fVar240;
      auVar194._12_4_ = fVar240;
      auVar194._16_4_ = fVar240;
      auVar194._20_4_ = fVar240;
      auVar194._24_4_ = fVar240;
      auVar194._28_4_ = fVar240;
      auVar167 = vminps_avx(auVar194,auVar86);
      auVar30._4_4_ = fVar208 * auVar238._4_4_;
      auVar30._0_4_ = fVar207 * auVar238._0_4_;
      auVar30._8_4_ = fVar209 * auVar238._8_4_;
      auVar30._12_4_ = fVar210 * auVar238._12_4_;
      auVar30._16_4_ = fVar211 * auVar238._16_4_;
      auVar30._20_4_ = fVar212 * auVar238._20_4_;
      auVar30._24_4_ = fVar172 * auVar238._24_4_;
      auVar30._28_4_ = auVar144._28_4_;
      auVar73 = vfmadd213ps_fma(auVar11,local_9c0,auVar30);
      auVar54._4_4_ = fStack_3bc;
      auVar54._0_4_ = local_3c0;
      auVar54._8_4_ = fStack_3b8;
      auVar54._12_4_ = fStack_3b4;
      auVar54._16_4_ = fStack_3b0;
      auVar54._20_4_ = fStack_3ac;
      auVar54._24_4_ = fStack_3a8;
      auVar54._28_4_ = fStack_3a4;
      auVar11 = vmaxps_avx(auVar54,auVar218);
      auVar132 = vfmadd213ps_fma(auVar87,local_980,ZEXT1632(auVar73));
      auVar31._4_4_ = auVar238._4_4_ * (float)local_7e0._4_4_;
      auVar31._0_4_ = auVar238._0_4_ * (float)local_7e0._0_4_;
      auVar31._8_4_ = auVar238._8_4_ * fStack_7d8;
      auVar31._12_4_ = auVar238._12_4_ * fStack_7d4;
      auVar31._16_4_ = auVar238._16_4_ * fStack_7d0;
      auVar31._20_4_ = auVar238._20_4_ * fStack_7cc;
      auVar31._24_4_ = auVar238._24_4_ * fStack_7c8;
      auVar31._28_4_ = 0;
      auVar73 = vfmadd231ps_fma(auVar31,local_9c0,_local_7c0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar73),_local_640,local_980);
      auVar203 = vandps_avx(ZEXT1632(auVar98),local_800);
      auVar221._8_4_ = 0x219392ef;
      auVar221._0_8_ = 0x219392ef219392ef;
      auVar221._12_4_ = 0x219392ef;
      auVar221._16_4_ = 0x219392ef;
      auVar221._20_4_ = 0x219392ef;
      auVar221._24_4_ = 0x219392ef;
      auVar221._28_4_ = 0x219392ef;
      auVar144 = vcmpps_avx(auVar203,auVar221,1);
      auVar203 = vrcpps_avx(ZEXT1632(auVar98));
      auVar222._8_4_ = 0x3f800000;
      auVar222._0_8_ = 0x3f8000003f800000;
      auVar222._12_4_ = 0x3f800000;
      auVar222._16_4_ = 0x3f800000;
      auVar222._20_4_ = 0x3f800000;
      auVar222._24_4_ = 0x3f800000;
      auVar222._28_4_ = 0x3f800000;
      auVar87 = ZEXT1632(auVar98);
      auVar73 = vfnmadd213ps_fma(auVar203,auVar87,auVar222);
      auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar203,auVar203);
      auVar204._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
      auVar204._8_4_ = auVar98._8_4_ ^ 0x80000000;
      auVar204._12_4_ = auVar98._12_4_ ^ 0x80000000;
      auVar204._16_4_ = 0x80000000;
      auVar204._20_4_ = 0x80000000;
      auVar204._24_4_ = 0x80000000;
      auVar204._28_4_ = 0x80000000;
      auVar32._4_4_ = auVar73._4_4_ * -auVar132._4_4_;
      auVar32._0_4_ = auVar73._0_4_ * -auVar132._0_4_;
      auVar32._8_4_ = auVar73._8_4_ * -auVar132._8_4_;
      auVar32._12_4_ = auVar73._12_4_ * -auVar132._12_4_;
      auVar32._16_4_ = 0x80000000;
      auVar32._20_4_ = 0x80000000;
      auVar32._24_4_ = 0x80000000;
      auVar32._28_4_ = 0x80000000;
      auVar203 = vcmpps_avx(auVar87,auVar204,1);
      auVar203 = vorps_avx(auVar203,auVar144);
      auVar260._8_4_ = 0xff800000;
      auVar260._0_8_ = 0xff800000ff800000;
      auVar260._12_4_ = 0xff800000;
      auVar260._16_4_ = 0xff800000;
      auVar260._20_4_ = 0xff800000;
      auVar260._24_4_ = 0xff800000;
      auVar260._28_4_ = 0xff800000;
      auVar203 = vblendvps_avx(auVar32,auVar260,auVar203);
      auVar11 = vmaxps_avx(auVar11,auVar203);
      auVar203 = vcmpps_avx(auVar87,auVar204,6);
      auVar203 = vorps_avx(auVar144,auVar203);
      auVar268._8_4_ = 0x7f800000;
      auVar268._0_8_ = 0x7f8000007f800000;
      auVar268._12_4_ = 0x7f800000;
      auVar268._16_4_ = 0x7f800000;
      auVar268._20_4_ = 0x7f800000;
      auVar268._24_4_ = 0x7f800000;
      auVar268._28_4_ = 0x7f800000;
      auVar203 = vblendvps_avx(auVar32,auVar268,auVar203);
      auVar87 = vminps_avx(auVar167,auVar203);
      fVar207 = -local_a00._0_4_;
      fVar208 = -local_a00._4_4_;
      fVar209 = -local_a00._8_4_;
      fVar210 = -local_a00._12_4_;
      fVar211 = -local_a00._16_4_;
      fVar212 = -local_a00._20_4_;
      fVar172 = -local_a00._24_4_;
      auVar181._0_8_ = local_740._0_8_ ^ 0x8000000080000000;
      auVar181._8_4_ = -local_740._8_4_;
      auVar181._12_4_ = -local_740._12_4_;
      auVar181._16_4_ = -local_740._16_4_;
      auVar181._20_4_ = -local_740._20_4_;
      auVar181._24_4_ = -local_740._24_4_;
      auVar181._28_4_ = local_740._28_4_ ^ 0x80000000;
      auVar203 = vsubps_avx(ZEXT832(0) << 0x20,auVar13);
      auVar144 = vsubps_avx(ZEXT832(0) << 0x20,auVar206);
      auVar33._4_4_ = auVar144._4_4_ * fVar208;
      auVar33._0_4_ = auVar144._0_4_ * fVar207;
      auVar33._8_4_ = auVar144._8_4_ * fVar209;
      auVar33._12_4_ = auVar144._12_4_ * fVar210;
      auVar33._16_4_ = auVar144._16_4_ * fVar211;
      auVar33._20_4_ = auVar144._20_4_ * fVar212;
      auVar33._24_4_ = auVar144._24_4_ * fVar172;
      auVar33._28_4_ = auVar144._28_4_;
      auVar73 = vfmadd231ps_fma(auVar33,auVar181,auVar203);
      auVar195._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
      auVar195._8_4_ = -local_9e0._8_4_;
      auVar195._12_4_ = -local_9e0._12_4_;
      auVar195._16_4_ = -local_9e0._16_4_;
      auVar195._20_4_ = -local_9e0._20_4_;
      auVar195._24_4_ = -local_9e0._24_4_;
      auVar195._28_4_ = local_9e0._28_4_ ^ 0x80000000;
      auVar203 = vsubps_avx(ZEXT832(0) << 0x20,auVar166);
      auVar132 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar195,auVar203);
      auVar34._4_4_ = fVar208 * (float)local_7e0._4_4_;
      auVar34._0_4_ = fVar207 * (float)local_7e0._0_4_;
      auVar34._8_4_ = fVar209 * fStack_7d8;
      auVar34._12_4_ = fVar210 * fStack_7d4;
      auVar34._16_4_ = fVar211 * fStack_7d0;
      auVar34._20_4_ = fVar212 * fStack_7cc;
      auVar34._24_4_ = fVar172 * fStack_7c8;
      auVar34._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar73 = vfmadd231ps_fma(auVar34,auVar181,_local_7c0);
      auVar98 = vfmadd231ps_fma(ZEXT1632(auVar73),_local_640,auVar195);
      auVar203 = vandps_avx(ZEXT1632(auVar98),local_800);
      auVar167 = vrcpps_avx(ZEXT1632(auVar98));
      auVar116._8_4_ = 0x219392ef;
      auVar116._0_8_ = 0x219392ef219392ef;
      auVar116._12_4_ = 0x219392ef;
      auVar116._16_4_ = 0x219392ef;
      auVar116._20_4_ = 0x219392ef;
      auVar116._24_4_ = 0x219392ef;
      auVar116._28_4_ = 0x219392ef;
      auVar144 = vcmpps_avx(auVar203,auVar116,1);
      auVar166 = ZEXT1632(auVar98);
      auVar73 = vfnmadd213ps_fma(auVar167,auVar166,auVar222);
      auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar167,auVar167);
      auVar196._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
      auVar196._8_4_ = auVar98._8_4_ ^ 0x80000000;
      auVar196._12_4_ = auVar98._12_4_ ^ 0x80000000;
      auVar196._16_4_ = 0x80000000;
      auVar196._20_4_ = 0x80000000;
      auVar196._24_4_ = 0x80000000;
      auVar196._28_4_ = 0x80000000;
      auVar35._4_4_ = auVar73._4_4_ * -auVar132._4_4_;
      auVar35._0_4_ = auVar73._0_4_ * -auVar132._0_4_;
      auVar35._8_4_ = auVar73._8_4_ * -auVar132._8_4_;
      auVar35._12_4_ = auVar73._12_4_ * -auVar132._12_4_;
      auVar35._16_4_ = 0x80000000;
      auVar35._20_4_ = 0x80000000;
      auVar35._24_4_ = 0x80000000;
      auVar35._28_4_ = 0x80000000;
      auVar203 = vcmpps_avx(auVar166,auVar196,1);
      auVar203 = vorps_avx(auVar203,auVar144);
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar203 = vblendvps_avx(auVar35,auVar117,auVar203);
      auVar11 = vmaxps_avx(auVar11,auVar203);
      auVar203 = vcmpps_avx(auVar166,auVar196,6);
      auVar203 = vorps_avx(auVar144,auVar203);
      auVar203 = vblendvps_avx(auVar35,auVar268,auVar203);
      auVar114 = vandps_avx(auVar114,local_520);
      local_440 = vminps_avx(auVar87,auVar203);
      auVar203 = vcmpps_avx(auVar11,local_440,2);
      auVar144 = auVar114 & auVar203;
      if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar144 >> 0x7f,0) == '\0') &&
            (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar144 >> 0xbf,0) == '\0') &&
          (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar144[0x1f]) {
        auVar251 = ZEXT3264(CONCAT824(uStack_928,
                                      CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
        goto LAB_01142419;
      }
      auVar53._4_4_ = fStack_3dc;
      auVar53._0_4_ = local_3e0;
      auVar53._8_4_ = fStack_3d8;
      auVar53._12_4_ = fStack_3d4;
      auVar53._16_4_ = uStack_3d0;
      auVar53._20_4_ = uStack_3cc;
      auVar53._24_4_ = uStack_3c8;
      auVar53._28_4_ = uStack_3c4;
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = 0x3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      auVar205._16_4_ = 0x3f800000;
      auVar205._20_4_ = 0x3f800000;
      auVar205._24_4_ = 0x3f800000;
      auVar205._28_4_ = 0x3f800000;
      auVar144 = vminps_avx(auVar53,auVar205);
      auVar167 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar144 = vmaxps_avx(auVar144,ZEXT832(0) << 0x20);
      auVar52._4_4_ = fStack_3fc;
      auVar52._0_4_ = local_400;
      auVar52._8_4_ = fStack_3f8;
      auVar52._12_4_ = fStack_3f4;
      auVar52._16_4_ = uStack_3f0;
      auVar52._20_4_ = uStack_3ec;
      auVar52._24_4_ = uStack_3e8;
      auVar52._28_4_ = uStack_3e4;
      auVar87 = vminps_avx(auVar52,auVar205);
      auVar87 = vmaxps_avx(auVar87,ZEXT832(0) << 0x20);
      auVar36._4_4_ = (auVar144._4_4_ + 1.0) * 0.125;
      auVar36._0_4_ = (auVar144._0_4_ + 0.0) * 0.125;
      auVar36._8_4_ = (auVar144._8_4_ + 2.0) * 0.125;
      auVar36._12_4_ = (auVar144._12_4_ + 3.0) * 0.125;
      auVar36._16_4_ = (auVar144._16_4_ + 4.0) * 0.125;
      auVar36._20_4_ = (auVar144._20_4_ + 5.0) * 0.125;
      auVar36._24_4_ = (auVar144._24_4_ + 6.0) * 0.125;
      auVar36._28_4_ = auVar144._28_4_ + 7.0;
      auVar73 = vfmadd213ps_fma(auVar36,local_780,local_760);
      auVar37._4_4_ = (auVar87._4_4_ + 1.0) * 0.125;
      auVar37._0_4_ = (auVar87._0_4_ + 0.0) * 0.125;
      auVar37._8_4_ = (auVar87._8_4_ + 2.0) * 0.125;
      auVar37._12_4_ = (auVar87._12_4_ + 3.0) * 0.125;
      auVar37._16_4_ = (auVar87._16_4_ + 4.0) * 0.125;
      auVar37._20_4_ = (auVar87._20_4_ + 5.0) * 0.125;
      auVar37._24_4_ = (auVar87._24_4_ + 6.0) * 0.125;
      auVar37._28_4_ = auVar87._28_4_ + 7.0;
      auVar132 = vfmadd213ps_fma(auVar37,local_780,local_760);
      auVar144 = vminps_avx(auVar145,local_7a0);
      auVar87 = vminps_avx(auVar14,auVar15);
      auVar144 = vminps_avx(auVar144,auVar87);
      auVar237 = vsubps_avx(auVar144,auVar237);
      auVar114 = vandps_avx(auVar203,auVar114);
      local_1a0 = ZEXT1632(auVar73);
      local_1c0 = ZEXT1632(auVar132);
      auVar38._4_4_ = auVar237._4_4_ * 0.99999976;
      auVar38._0_4_ = auVar237._0_4_ * 0.99999976;
      auVar38._8_4_ = auVar237._8_4_ * 0.99999976;
      auVar38._12_4_ = auVar237._12_4_ * 0.99999976;
      auVar38._16_4_ = auVar237._16_4_ * 0.99999976;
      auVar38._20_4_ = auVar237._20_4_ * 0.99999976;
      auVar38._24_4_ = auVar237._24_4_ * 0.99999976;
      auVar38._28_4_ = auVar203._28_4_;
      auVar203 = vmaxps_avx(ZEXT832(0) << 0x20,auVar38);
      auVar39._4_4_ = auVar203._4_4_ * auVar203._4_4_;
      auVar39._0_4_ = auVar203._0_4_ * auVar203._0_4_;
      auVar39._8_4_ = auVar203._8_4_ * auVar203._8_4_;
      auVar39._12_4_ = auVar203._12_4_ * auVar203._12_4_;
      auVar39._16_4_ = auVar203._16_4_ * auVar203._16_4_;
      auVar39._20_4_ = auVar203._20_4_ * auVar203._20_4_;
      auVar39._24_4_ = auVar203._24_4_ * auVar203._24_4_;
      auVar39._28_4_ = auVar203._28_4_;
      auVar237 = vsubps_avx(auVar182,auVar39);
      auVar40._4_4_ = auVar237._4_4_ * fVar128 * 4.0;
      auVar40._0_4_ = auVar237._0_4_ * fVar96 * 4.0;
      auVar40._8_4_ = auVar237._8_4_ * fVar129 * 4.0;
      auVar40._12_4_ = auVar237._12_4_ * fVar198 * 4.0;
      auVar40._16_4_ = auVar237._16_4_ * fVar151 * 4.0;
      auVar40._20_4_ = auVar237._20_4_ * fVar152 * 4.0;
      auVar40._24_4_ = auVar237._24_4_ * fVar153 * 4.0;
      auVar40._28_4_ = auVar203._28_4_;
      auVar144 = vsubps_avx(auVar26,auVar40);
      local_8e0 = vcmpps_avx(auVar144,ZEXT832(0) << 0x20,5);
      auVar203 = local_8e0;
      if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0x7f,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_8e0 >> 0xbf,0) == '\0') &&
          (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_8e0[0x1f]) {
        auVar206 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar192 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar182 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar166 = ZEXT1232(ZEXT812(0)) << 0x20;
        _local_c00 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar223._8_4_ = 0x7f800000;
        auVar223._0_8_ = 0x7f8000007f800000;
        auVar223._12_4_ = 0x7f800000;
        auVar223._16_4_ = 0x7f800000;
        auVar223._20_4_ = 0x7f800000;
        auVar223._24_4_ = 0x7f800000;
        auVar223._28_4_ = 0x7f800000;
        auVar242._8_4_ = 0xff800000;
        auVar242._0_8_ = 0xff800000ff800000;
        auVar242._12_4_ = 0xff800000;
        auVar242._16_4_ = 0xff800000;
        auVar242._20_4_ = 0xff800000;
        auVar242._24_4_ = 0xff800000;
        auVar242._28_4_ = 0xff800000;
        local_8e0 = auVar13;
      }
      else {
        auVar87 = vrcpps_avx(local_360);
        auVar168._8_4_ = 0x3f800000;
        auVar168._0_8_ = 0x3f8000003f800000;
        auVar168._12_4_ = 0x3f800000;
        auVar168._16_4_ = 0x3f800000;
        auVar168._20_4_ = 0x3f800000;
        auVar168._24_4_ = 0x3f800000;
        auVar168._28_4_ = 0x3f800000;
        auVar73 = vfnmadd213ps_fma(local_360,auVar87,auVar168);
        auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar87,auVar87);
        auVar87 = vsqrtps_avx(auVar144);
        auVar169._0_8_ = local_340._0_8_ ^ 0x8000000080000000;
        auVar169._8_4_ = -local_340._8_4_;
        auVar169._12_4_ = -local_340._12_4_;
        auVar169._16_4_ = -local_340._16_4_;
        auVar169._20_4_ = -local_340._20_4_;
        auVar169._24_4_ = -local_340._24_4_;
        auVar169._28_4_ = -local_340._28_4_;
        auVar182 = vsubps_avx(auVar169,auVar87);
        auVar167 = vsubps_avx(auVar87,local_340);
        fVar96 = auVar182._0_4_ * auVar73._0_4_;
        fVar128 = auVar182._4_4_ * auVar73._4_4_;
        auVar41._4_4_ = fVar128;
        auVar41._0_4_ = fVar96;
        fVar129 = auVar182._8_4_ * auVar73._8_4_;
        auVar41._8_4_ = fVar129;
        fVar198 = auVar182._12_4_ * auVar73._12_4_;
        auVar41._12_4_ = fVar198;
        fVar207 = auVar182._16_4_ * 0.0;
        auVar41._16_4_ = fVar207;
        fVar208 = auVar182._20_4_ * 0.0;
        auVar41._20_4_ = fVar208;
        fVar209 = auVar182._24_4_ * 0.0;
        auVar41._24_4_ = fVar209;
        auVar41._28_4_ = auVar87._28_4_;
        fVar210 = auVar167._0_4_ * auVar73._0_4_;
        fVar211 = auVar167._4_4_ * auVar73._4_4_;
        auVar42._4_4_ = fVar211;
        auVar42._0_4_ = fVar210;
        fVar212 = auVar167._8_4_ * auVar73._8_4_;
        auVar42._8_4_ = fVar212;
        fVar172 = auVar167._12_4_ * auVar73._12_4_;
        auVar42._12_4_ = fVar172;
        fVar151 = auVar167._16_4_ * 0.0;
        auVar42._16_4_ = fVar151;
        fVar152 = auVar167._20_4_ * 0.0;
        auVar42._20_4_ = fVar152;
        fVar153 = auVar167._24_4_ * 0.0;
        auVar42._24_4_ = fVar153;
        auVar42._28_4_ = local_760._0_4_;
        auVar73 = vfmadd213ps_fma(auVar241,auVar41,auVar271);
        auVar132 = vfmadd213ps_fma(auVar241,auVar42,auVar271);
        auVar182 = ZEXT1632(CONCAT412(fVar130 * auVar73._12_4_,
                                      CONCAT48(fVar131 * auVar73._8_4_,
                                               CONCAT44(fVar127 * auVar73._4_4_,
                                                        fVar126 * auVar73._0_4_))));
        auVar87 = ZEXT1632(CONCAT412(auVar132._12_4_ * fVar130,
                                     CONCAT48(auVar132._8_4_ * fVar131,
                                              CONCAT44(auVar132._4_4_ * fVar127,
                                                       auVar132._0_4_ * fVar126))));
        auVar73 = vfmadd213ps_fma(local_2e0,auVar182,local_920);
        auVar132 = vfmadd213ps_fma(local_2e0,auVar87,local_920);
        auVar98 = vfmadd213ps_fma(local_300,auVar182,auVar229);
        auVar72 = vfmadd213ps_fma(local_300,auVar87,auVar229);
        auVar99 = vfmadd213ps_fma(auVar182,local_2c0,auVar84);
        auVar154 = vfmadd213ps_fma(local_2c0,auVar87,auVar84);
        auVar43._4_4_ = (float)local_640._4_4_ * fVar128;
        auVar43._0_4_ = (float)local_640._0_4_ * fVar96;
        auVar43._8_4_ = fStack_638 * fVar129;
        auVar43._12_4_ = fStack_634 * fVar198;
        auVar43._16_4_ = fStack_630 * fVar207;
        auVar43._20_4_ = fStack_62c * fVar208;
        auVar43._24_4_ = fStack_628 * fVar209;
        auVar43._28_4_ = 0;
        auVar182 = vsubps_avx(auVar43,ZEXT1632(auVar73));
        auVar197._0_4_ = (float)local_7c0._0_4_ * fVar96;
        auVar197._4_4_ = (float)local_7c0._4_4_ * fVar128;
        auVar197._8_4_ = fStack_7b8 * fVar129;
        auVar197._12_4_ = fStack_7b4 * fVar198;
        auVar197._16_4_ = fStack_7b0 * fVar207;
        auVar197._20_4_ = fStack_7ac * fVar208;
        auVar197._24_4_ = fStack_7a8 * fVar209;
        auVar197._28_4_ = 0;
        auVar166 = vsubps_avx(auVar197,ZEXT1632(auVar98));
        auVar44._4_4_ = (float)local_7e0._4_4_ * fVar128;
        auVar44._0_4_ = (float)local_7e0._0_4_ * fVar96;
        auVar44._8_4_ = fStack_7d8 * fVar129;
        auVar44._12_4_ = fStack_7d4 * fVar198;
        auVar44._16_4_ = fStack_7d0 * fVar207;
        auVar44._20_4_ = fStack_7cc * fVar208;
        auVar44._24_4_ = fStack_7c8 * fVar209;
        auVar44._28_4_ = 0;
        auVar87 = vsubps_avx(auVar44,ZEXT1632(auVar99));
        _local_c00 = auVar87._0_28_;
        auVar45._4_4_ = fVar211 * (float)local_640._4_4_;
        auVar45._0_4_ = fVar210 * (float)local_640._0_4_;
        auVar45._8_4_ = fVar212 * fStack_638;
        auVar45._12_4_ = fVar172 * fStack_634;
        auVar45._16_4_ = fVar151 * fStack_630;
        auVar45._20_4_ = fVar152 * fStack_62c;
        auVar45._24_4_ = fVar153 * fStack_628;
        auVar45._28_4_ = auVar87._28_4_;
        auVar167 = vsubps_avx(auVar45,ZEXT1632(auVar132));
        auVar46._4_4_ = (float)local_7c0._4_4_ * fVar211;
        auVar46._0_4_ = (float)local_7c0._0_4_ * fVar210;
        auVar46._8_4_ = fStack_7b8 * fVar212;
        auVar46._12_4_ = fStack_7b4 * fVar172;
        auVar46._16_4_ = fStack_7b0 * fVar151;
        auVar46._20_4_ = fStack_7ac * fVar152;
        auVar46._24_4_ = fStack_7a8 * fVar153;
        auVar46._28_4_ = 0;
        auVar206 = vsubps_avx(auVar46,ZEXT1632(auVar72));
        auVar47._4_4_ = (float)local_7e0._4_4_ * fVar211;
        auVar47._0_4_ = (float)local_7e0._0_4_ * fVar210;
        auVar47._8_4_ = fStack_7d8 * fVar212;
        auVar47._12_4_ = fStack_7d4 * fVar172;
        auVar47._16_4_ = fStack_7d0 * fVar151;
        auVar47._20_4_ = fStack_7cc * fVar152;
        auVar47._24_4_ = fStack_7c8 * fVar153;
        auVar47._28_4_ = 0;
        auVar87 = vsubps_avx(auVar47,ZEXT1632(auVar154));
        auVar192 = auVar87._0_28_;
        auVar87 = vcmpps_avx(auVar144,_DAT_01f7b000,5);
        auVar224._8_4_ = 0x7f800000;
        auVar224._0_8_ = 0x7f8000007f800000;
        auVar224._12_4_ = 0x7f800000;
        auVar224._16_4_ = 0x7f800000;
        auVar224._20_4_ = 0x7f800000;
        auVar224._24_4_ = 0x7f800000;
        auVar224._28_4_ = 0x7f800000;
        auVar223 = vblendvps_avx(auVar224,auVar41,auVar87);
        auVar144 = vandps_avx(local_800,local_320);
        auVar144 = vmaxps_avx(local_580,auVar144);
        auVar48._4_4_ = auVar144._4_4_ * 1.9073486e-06;
        auVar48._0_4_ = auVar144._0_4_ * 1.9073486e-06;
        auVar48._8_4_ = auVar144._8_4_ * 1.9073486e-06;
        auVar48._12_4_ = auVar144._12_4_ * 1.9073486e-06;
        auVar48._16_4_ = auVar144._16_4_ * 1.9073486e-06;
        auVar48._20_4_ = auVar144._20_4_ * 1.9073486e-06;
        auVar48._24_4_ = auVar144._24_4_ * 1.9073486e-06;
        auVar48._28_4_ = auVar144._28_4_;
        auVar144 = vandps_avx(local_800,auVar12);
        auVar144 = vcmpps_avx(auVar144,auVar48,1);
        auVar243._8_4_ = 0xff800000;
        auVar243._0_8_ = 0xff800000ff800000;
        auVar243._12_4_ = 0xff800000;
        auVar243._16_4_ = 0xff800000;
        auVar243._20_4_ = 0xff800000;
        auVar243._24_4_ = 0xff800000;
        auVar243._28_4_ = 0xff800000;
        auVar242 = vblendvps_avx(auVar243,auVar42,auVar87);
        auVar12 = auVar87 & auVar144;
        if ((((((((auVar12 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar12 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar12 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar12 >> 0x7f,0) != '\0') ||
              (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar12 >> 0xbf,0) != '\0') ||
            (auVar12 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar12[0x1f] < '\0') {
          auVar203 = vandps_avx(auVar87,auVar144);
          auVar144 = vcmpps_avx(auVar237,ZEXT832(0) << 0x20,2);
          auVar239._8_4_ = 0xff800000;
          auVar239._0_8_ = 0xff800000ff800000;
          auVar239._12_4_ = 0xff800000;
          auVar239._16_4_ = 0xff800000;
          auVar239._20_4_ = 0xff800000;
          auVar239._24_4_ = 0xff800000;
          auVar239._28_4_ = 0xff800000;
          auVar125._8_4_ = 0x7f800000;
          auVar125._0_8_ = 0x7f8000007f800000;
          auVar125._12_4_ = 0x7f800000;
          auVar125._16_4_ = 0x7f800000;
          auVar125._20_4_ = 0x7f800000;
          auVar125._24_4_ = 0x7f800000;
          auVar125._28_4_ = 0x7f800000;
          auVar237 = vblendvps_avx(auVar125,auVar239,auVar144);
          auVar73 = vpackssdw_avx(auVar203._0_16_,auVar203._16_16_);
          auVar12 = vpmovsxwd_avx2(auVar73);
          auVar223 = vblendvps_avx(auVar223,auVar237,auVar12);
          auVar237 = vblendvps_avx(auVar239,auVar125,auVar144);
          auVar242 = vblendvps_avx(auVar242,auVar237,auVar12);
          auVar150._0_8_ = auVar203._0_8_ ^ 0xffffffffffffffff;
          auVar150._8_4_ = auVar203._8_4_ ^ 0xffffffff;
          auVar150._12_4_ = auVar203._12_4_ ^ 0xffffffff;
          auVar150._16_4_ = auVar203._16_4_ ^ 0xffffffff;
          auVar150._20_4_ = auVar203._20_4_ ^ 0xffffffff;
          auVar150._24_4_ = auVar203._24_4_ ^ 0xffffffff;
          auVar150._28_4_ = auVar203._28_4_ ^ 0xffffffff;
          auVar203 = vorps_avx(auVar144,auVar150);
          auVar203 = vandps_avx(auVar87,auVar203);
        }
      }
      local_4a0 = auVar11;
      local_480 = vminps_avx(local_440,auVar223);
      _local_840 = vmaxps_avx(auVar11,auVar242);
      _local_460 = _local_840;
      auVar237 = vcmpps_avx(auVar11,local_480,2);
      local_5c0 = vandps_avx(auVar114,auVar237);
      auVar237 = vcmpps_avx(_local_840,local_440,2);
      _local_a20 = vandps_avx(auVar114,auVar237);
      auVar244 = ZEXT3264(_local_a20);
      auVar114 = vorps_avx(_local_a20,local_5c0);
      if ((((((((auVar114 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar114 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar114 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar114 >> 0x7f,0) == '\0') &&
            (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar114 >> 0xbf,0) == '\0') &&
          (auVar114 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar114[0x1f]) {
        auVar251 = ZEXT3264(CONCAT824(uStack_928,
                                      CONCAT816(uStack_930,CONCAT88(uStack_938,local_940))));
        goto LAB_01142419;
      }
      auVar49._4_4_ = (float)local_7e0._4_4_ * auVar192._4_4_;
      auVar49._0_4_ = (float)local_7e0._0_4_ * auVar192._0_4_;
      auVar49._8_4_ = fStack_7d8 * auVar192._8_4_;
      auVar49._12_4_ = fStack_7d4 * auVar192._12_4_;
      auVar49._16_4_ = fStack_7d0 * auVar192._16_4_;
      auVar49._20_4_ = fStack_7cc * auVar192._20_4_;
      auVar49._24_4_ = fStack_7c8 * auVar192._24_4_;
      auVar49._28_4_ = auVar114._28_4_;
      auVar73 = vfmadd213ps_fma(auVar206,_local_7c0,auVar49);
      auVar73 = vfmadd213ps_fma(auVar167,_local_640,ZEXT1632(auVar73));
      auVar90._0_8_ = auVar203._0_8_ ^ 0xffffffffffffffff;
      auVar90._8_4_ = auVar203._8_4_ ^ 0xffffffff;
      auVar90._12_4_ = auVar203._12_4_ ^ 0xffffffff;
      auVar90._16_4_ = auVar203._16_4_ ^ 0xffffffff;
      auVar90._20_4_ = auVar203._20_4_ ^ 0xffffffff;
      auVar90._24_4_ = auVar203._24_4_ ^ 0xffffffff;
      auVar90._28_4_ = auVar203._28_4_ ^ 0xffffffff;
      auVar114 = vandps_avx(ZEXT1632(auVar73),local_800);
      auVar147._8_4_ = 0x3e99999a;
      auVar147._0_8_ = 0x3e99999a3e99999a;
      auVar147._12_4_ = 0x3e99999a;
      auVar147._16_4_ = 0x3e99999a;
      auVar147._20_4_ = 0x3e99999a;
      auVar147._24_4_ = 0x3e99999a;
      auVar147._28_4_ = 0x3e99999a;
      auVar114 = vcmpps_avx(auVar114,auVar147,1);
      local_600 = vorps_avx(auVar114,auVar90);
      auVar50._4_4_ = (float)local_7e0._4_4_ * (float)local_c00._4_4_;
      auVar50._0_4_ = (float)local_7e0._0_4_ * (float)local_c00._0_4_;
      auVar50._8_4_ = fStack_7d8 * fStack_bf8;
      auVar50._12_4_ = fStack_7d4 * fStack_bf4;
      auVar50._16_4_ = fStack_7d0 * fStack_bf0;
      auVar50._20_4_ = fStack_7cc * fStack_bec;
      auVar50._24_4_ = fStack_7c8 * fStack_be8;
      auVar50._28_4_ = local_600._28_4_;
      auVar73 = vfmadd213ps_fma(auVar166,_local_7c0,auVar50);
      auVar73 = vfmadd213ps_fma(auVar182,_local_640,ZEXT1632(auVar73));
      auVar114 = vandps_avx(ZEXT1632(auVar73),local_800);
      auVar114 = vcmpps_avx(auVar114,auVar147,1);
      auVar114 = vorps_avx(auVar114,auVar90);
      auVar119._8_4_ = 3;
      auVar119._0_8_ = 0x300000003;
      auVar119._12_4_ = 3;
      auVar119._16_4_ = 3;
      auVar119._20_4_ = 3;
      auVar119._24_4_ = 3;
      auVar119._28_4_ = 3;
      auVar148._8_4_ = 2;
      auVar148._0_8_ = 0x200000002;
      auVar148._12_4_ = 2;
      auVar148._16_4_ = 2;
      auVar148._20_4_ = 2;
      auVar148._24_4_ = 2;
      auVar148._28_4_ = 2;
      auVar114 = vblendvps_avx(auVar148,auVar119,auVar114);
      local_620._4_4_ = local_c04;
      local_620._0_4_ = local_c04;
      local_620._8_4_ = local_c04;
      local_620._12_4_ = local_c04;
      local_620._16_4_ = local_c04;
      local_620._20_4_ = local_c04;
      local_620._24_4_ = local_c04;
      local_620._28_4_ = local_c04;
      local_5e0 = vpcmpgtd_avx2(auVar114,local_620);
      local_4c0 = vpandn_avx2(local_5e0,local_5c0);
      local_820._4_4_ = auVar11._4_4_ + (float)local_880._4_4_;
      local_820._0_4_ = auVar11._0_4_ + (float)local_880._0_4_;
      fStack_818 = auVar11._8_4_ + fStack_878;
      fStack_814 = auVar11._12_4_ + fStack_874;
      fStack_810 = auVar11._16_4_ + fStack_870;
      fStack_80c = auVar11._20_4_ + fStack_86c;
      fStack_808 = auVar11._24_4_ + fStack_868;
      fStack_804 = auVar11._28_4_ + fStack_864;
      auVar226 = ZEXT3264(_local_a20);
      while( true ) {
        auVar114 = _local_460;
        fStack_adc = auVar74._4_4_;
        fStack_ad8 = auVar74._8_4_;
        fStack_ad4 = auVar74._12_4_;
        if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_4c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_4c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_4c0 >> 0x7f,0) == '\0') &&
              (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_4c0 >> 0xbf,0) == '\0') &&
            (local_4c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_4c0[0x1f]) break;
        auVar120._8_4_ = 0x7f800000;
        auVar120._0_8_ = 0x7f8000007f800000;
        auVar120._12_4_ = 0x7f800000;
        auVar120._16_4_ = 0x7f800000;
        auVar120._20_4_ = 0x7f800000;
        auVar120._24_4_ = 0x7f800000;
        auVar120._28_4_ = 0x7f800000;
        auVar114 = vblendvps_avx(auVar120,auVar11,local_4c0);
        auVar203 = vshufps_avx(auVar114,auVar114,0xb1);
        auVar203 = vminps_avx(auVar114,auVar203);
        auVar237 = vshufpd_avx(auVar203,auVar203,5);
        auVar203 = vminps_avx(auVar203,auVar237);
        auVar237 = vpermpd_avx2(auVar203,0x4e);
        auVar203 = vminps_avx(auVar203,auVar237);
        auVar203 = vcmpps_avx(auVar114,auVar203,0);
        auVar237 = local_4c0 & auVar203;
        auVar114 = local_4c0;
        if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar237 >> 0x7f,0) != '\0') ||
              (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar237 >> 0xbf,0) != '\0') ||
            (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar237[0x1f] < '\0') {
          auVar114 = vandps_avx(auVar203,local_4c0);
        }
        uVar58 = vmovmskps_avx(auVar114);
        iVar16 = 0;
        for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
          iVar16 = iVar16 + 1;
        }
        uVar61 = (ulong)(uint)(iVar16 << 2);
        *(undefined4 *)(local_4c0 + uVar61) = 0;
        uVar58 = *(uint *)(local_1a0 + uVar61);
        uVar62 = *(uint *)(local_4a0 + uVar61);
        fVar96 = auVar4._0_4_;
        if ((float)local_960._0_4_ < 0.0) {
          auVar244 = ZEXT1664(auVar244._0_16_);
          fVar96 = sqrtf((float)local_960._0_4_);
          uVar61 = extraout_RAX;
        }
        auVar132 = vminps_avx(auVar7,auVar9);
        auVar73 = vmaxps_avx(auVar7,auVar9);
        auVar98 = vminps_avx(auVar8,auVar74);
        auVar72 = vminps_avx(auVar132,auVar98);
        auVar132 = vmaxps_avx(auVar8,auVar74);
        auVar98 = vmaxps_avx(auVar73,auVar132);
        auVar73 = vandps_avx(auVar72,auVar227);
        auVar132 = vandps_avx(auVar98,auVar227);
        auVar73 = vmaxps_avx(auVar73,auVar132);
        auVar132 = vmovshdup_avx(auVar73);
        auVar132 = vmaxss_avx(auVar132,auVar73);
        auVar73 = vshufpd_avx(auVar73,auVar73,1);
        auVar73 = vmaxss_avx(auVar73,auVar132);
        local_920._0_4_ = auVar73._0_4_ * 1.9073486e-06;
        local_980._0_4_ = fVar96 * 1.9073486e-06;
        local_7a0._0_16_ = vshufps_avx(auVar98,auVar98,0xff);
        auVar73 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar58),0x10);
        for (uVar65 = 0; bVar67 = (byte)uVar61, uVar65 != 5; uVar65 = uVar65 + 1) {
          auVar98 = vmovshdup_avx(auVar73);
          fVar131 = 1.0 - auVar98._0_4_;
          auVar132 = vshufps_avx(auVar73,auVar73,0x55);
          fVar96 = auVar132._0_4_;
          auVar100._0_4_ = fVar94 * fVar96;
          fVar126 = auVar132._4_4_;
          auVar100._4_4_ = auVar9._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar100._8_4_ = auVar9._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar100._12_4_ = auVar9._12_4_ * fVar128;
          auVar133._4_4_ = fVar131;
          auVar133._0_4_ = fVar131;
          auVar133._8_4_ = fVar131;
          auVar133._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar100,auVar133,auVar7);
          auVar155._0_4_ = fVar95 * fVar96;
          auVar155._4_4_ = auVar8._4_4_ * fVar126;
          auVar155._8_4_ = auVar8._8_4_ * fVar127;
          auVar155._12_4_ = auVar8._12_4_ * fVar128;
          auVar72 = vfmadd231ps_fma(auVar155,auVar133,auVar9);
          auVar188._0_4_ = fVar96 * auVar72._0_4_;
          auVar188._4_4_ = fVar126 * auVar72._4_4_;
          auVar188._8_4_ = fVar127 * auVar72._8_4_;
          auVar188._12_4_ = fVar128 * auVar72._12_4_;
          auVar99 = vfmadd231ps_fma(auVar188,auVar133,auVar132);
          auVar101._0_4_ = fVar96 * fVar93;
          auVar101._4_4_ = fVar126 * fStack_adc;
          auVar101._8_4_ = fVar127 * fStack_ad8;
          auVar101._12_4_ = fVar128 * fStack_ad4;
          auVar132 = vfmadd231ps_fma(auVar101,auVar133,auVar8);
          auVar174._0_4_ = fVar96 * auVar132._0_4_;
          auVar174._4_4_ = fVar126 * auVar132._4_4_;
          auVar174._8_4_ = fVar127 * auVar132._8_4_;
          auVar174._12_4_ = fVar128 * auVar132._12_4_;
          auVar154 = vfmadd231ps_fma(auVar174,auVar133,auVar72);
          fVar129 = auVar73._0_4_;
          auVar102._4_4_ = fVar129;
          auVar102._0_4_ = fVar129;
          auVar102._8_4_ = fVar129;
          auVar102._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar102,local_950,_DAT_01f45a50);
          auVar76._0_4_ = fVar96 * auVar154._0_4_;
          auVar76._4_4_ = fVar126 * auVar154._4_4_;
          auVar76._8_4_ = fVar127 * auVar154._8_4_;
          auVar76._12_4_ = fVar128 * auVar154._12_4_;
          auVar72 = vfmadd231ps_fma(auVar76,auVar99,auVar133);
          local_8e0._0_16_ = auVar72;
          auVar72 = vsubps_avx(auVar132,auVar72);
          auVar132 = vdpps_avx(auVar72,auVar72,0x7f);
          fVar96 = auVar132._0_4_;
          if (fVar96 < 0.0) {
            local_9c0._0_16_ = auVar99;
            auVar261._0_4_ = sqrtf(fVar96);
            auVar261._4_60_ = extraout_var;
            auVar77 = auVar261._0_16_;
            uVar61 = extraout_RAX_00;
            auVar99 = local_9c0._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar99 = vsubps_avx(auVar154,auVar99);
          auVar215._0_4_ = auVar99._0_4_ * 3.0;
          auVar215._4_4_ = auVar99._4_4_ * 3.0;
          auVar215._8_4_ = auVar99._8_4_ * 3.0;
          auVar215._12_4_ = auVar99._12_4_ * 3.0;
          auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar98);
          auVar154 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,ZEXT416((uint)fVar131));
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar99._0_4_ * 6.0;
          fVar127 = auVar154._0_4_ * 6.0;
          fVar128 = auVar98._0_4_ * 6.0;
          auVar156._0_4_ = fVar128 * fVar93;
          auVar156._4_4_ = fVar128 * fStack_adc;
          auVar156._8_4_ = fVar128 * fStack_ad8;
          auVar156._12_4_ = fVar128 * fStack_ad4;
          auVar103._4_4_ = fVar127;
          auVar103._0_4_ = fVar127;
          auVar103._8_4_ = fVar127;
          auVar103._12_4_ = fVar127;
          auVar98 = vfmadd132ps_fma(auVar103,auVar156,auVar8);
          auVar157._4_4_ = fVar126;
          auVar157._0_4_ = fVar126;
          auVar157._8_4_ = fVar126;
          auVar157._12_4_ = fVar126;
          auVar98 = vfmadd132ps_fma(auVar157,auVar98,auVar9);
          auVar99 = vdpps_avx(auVar215,auVar215,0x7f);
          auVar104._4_4_ = fVar131;
          auVar104._0_4_ = fVar131;
          auVar104._8_4_ = fVar131;
          auVar104._12_4_ = fVar131;
          auVar71 = vfmadd132ps_fma(auVar104,auVar98,auVar7);
          auVar98 = vblendps_avx(auVar99,_DAT_01f45a50,0xe);
          auVar154 = vrsqrtss_avx(auVar98,auVar98);
          fVar128 = auVar99._0_4_;
          fVar126 = auVar154._0_4_;
          auVar154 = vdpps_avx(auVar215,auVar71,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar105._0_4_ = auVar71._0_4_ * fVar128;
          auVar105._4_4_ = auVar71._4_4_ * fVar128;
          auVar105._8_4_ = auVar71._8_4_ * fVar128;
          auVar105._12_4_ = auVar71._12_4_ * fVar128;
          fVar127 = auVar154._0_4_;
          auVar189._0_4_ = auVar215._0_4_ * fVar127;
          auVar189._4_4_ = auVar215._4_4_ * fVar127;
          auVar189._8_4_ = auVar215._8_4_ * fVar127;
          auVar189._12_4_ = auVar215._12_4_ * fVar127;
          auVar154 = vsubps_avx(auVar105,auVar189);
          auVar98 = vrcpss_avx(auVar98,auVar98);
          auVar71 = vfnmadd213ss_fma(auVar98,auVar99,ZEXT416(0x40000000));
          fVar127 = auVar98._0_4_ * auVar71._0_4_;
          auVar98 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                               ZEXT416((uint)(fVar129 * (float)local_980._0_4_)));
          auVar226 = ZEXT1664(auVar98);
          uVar51 = CONCAT44(auVar215._4_4_,auVar215._0_4_);
          auVar201._0_8_ = uVar51 ^ 0x8000000080000000;
          auVar201._8_4_ = -auVar215._8_4_;
          auVar201._12_4_ = -auVar215._12_4_;
          auVar158._0_4_ = fVar126 * auVar154._0_4_ * fVar127;
          auVar158._4_4_ = fVar126 * auVar154._4_4_ * fVar127;
          auVar158._8_4_ = fVar126 * auVar154._8_4_ * fVar127;
          auVar158._12_4_ = fVar126 * auVar154._12_4_ * fVar127;
          auVar249._0_4_ = auVar215._0_4_ * fVar126;
          auVar249._4_4_ = auVar215._4_4_ * fVar126;
          auVar249._8_4_ = auVar215._8_4_ * fVar126;
          auVar249._12_4_ = auVar215._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_9c0._0_4_ = auVar77._0_4_;
            local_9e0._0_16_ = auVar249;
            local_a00._0_16_ = auVar158;
            fVar126 = sqrtf(fVar128);
            auVar77 = ZEXT416((uint)local_9c0._0_4_);
            auVar226 = ZEXT464(auVar98._0_4_);
            uVar61 = extraout_RAX_01;
            auVar158 = local_a00._0_16_;
            auVar249 = local_9e0._0_16_;
          }
          else {
            auVar99 = vsqrtss_avx(auVar99,auVar99);
            fVar126 = auVar99._0_4_;
          }
          auVar99 = vdpps_avx(auVar72,auVar249,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar77,auVar226._0_16_);
          auVar154 = vdpps_avx(auVar201,auVar249,0x7f);
          auVar71 = vdpps_avx(auVar72,auVar158,0x7f);
          auVar97 = vdpps_avx(local_950,auVar249,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)(auVar77._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_920._0_4_ / fVar126)),auVar173);
          fVar126 = auVar154._0_4_ + auVar71._0_4_;
          auVar78._0_4_ = auVar99._0_4_ * auVar99._0_4_;
          auVar78._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar78._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar78._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar154 = vdpps_avx(auVar72,auVar201,0x7f);
          auVar71 = vsubps_avx(auVar132,auVar78);
          auVar77 = vrsqrtss_avx(auVar71,auVar71);
          fVar128 = auVar71._0_4_;
          fVar127 = auVar77._0_4_;
          fVar127 = fVar127 * 1.5 + fVar128 * -0.5 * fVar127 * fVar127 * fVar127;
          auVar77 = vdpps_avx(auVar72,local_950,0x7f);
          auVar154 = vfnmadd231ss_fma(auVar154,auVar99,ZEXT416((uint)fVar126));
          auVar77 = vfnmadd231ss_fma(auVar77,auVar99,auVar97);
          if (fVar128 < 0.0) {
            local_9c0._0_16_ = auVar99;
            local_9e0._0_16_ = ZEXT416((uint)fVar126);
            local_a00._0_16_ = auVar97;
            local_740._0_16_ = auVar154;
            local_760._0_4_ = fVar127;
            local_780._0_16_ = auVar77;
            fVar128 = sqrtf(fVar128);
            auVar226 = ZEXT464(auVar98._0_4_);
            uVar61 = extraout_RAX_02;
            fVar127 = (float)local_760._0_4_;
            auVar77 = local_780._0_16_;
            auVar154 = local_740._0_16_;
            auVar99 = local_9c0._0_16_;
            auVar97 = local_a00._0_16_;
            auVar98 = local_9e0._0_16_;
          }
          else {
            auVar98 = vsqrtss_avx(auVar71,auVar71);
            fVar128 = auVar98._0_4_;
            auVar98 = ZEXT416((uint)fVar126);
          }
          auVar244 = ZEXT1664(auVar99);
          auVar71 = vpermilps_avx(local_8e0._0_16_,0xff);
          fVar128 = fVar128 - auVar71._0_4_;
          auVar71 = vshufps_avx(auVar215,auVar215,0xff);
          auVar154 = vfmsub213ss_fma(auVar154,ZEXT416((uint)fVar127),auVar71);
          auVar159._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
          auVar159._8_4_ = auVar97._8_4_ ^ 0x80000000;
          auVar159._12_4_ = auVar97._12_4_ ^ 0x80000000;
          auVar175._0_8_ = auVar154._0_8_ ^ 0x8000000080000000;
          auVar175._8_4_ = auVar154._8_4_ ^ 0x80000000;
          auVar175._12_4_ = auVar154._12_4_ ^ 0x80000000;
          auVar134 = ZEXT416((uint)(auVar77._0_4_ * fVar127));
          auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar97._0_4_ * auVar154._0_4_)),auVar98,auVar134
                                   );
          auVar154 = vinsertps_avx(auVar175,auVar134,0x1c);
          uVar69 = auVar77._0_4_;
          auVar176._4_4_ = uVar69;
          auVar176._0_4_ = uVar69;
          auVar176._8_4_ = uVar69;
          auVar176._12_4_ = uVar69;
          auVar154 = vdivps_avx(auVar154,auVar176);
          auVar98 = vinsertps_avx(auVar98,auVar159,0x10);
          auVar98 = vdivps_avx(auVar98,auVar176);
          fVar126 = auVar99._0_4_;
          auVar135._0_4_ = fVar126 * auVar154._0_4_ + fVar128 * auVar98._0_4_;
          auVar135._4_4_ = fVar126 * auVar154._4_4_ + fVar128 * auVar98._4_4_;
          auVar135._8_4_ = fVar126 * auVar154._8_4_ + fVar128 * auVar98._8_4_;
          auVar135._12_4_ = fVar126 * auVar154._12_4_ + fVar128 * auVar98._12_4_;
          auVar73 = vsubps_avx(auVar73,auVar135);
          auVar98 = vandps_avx(auVar99,auVar227);
          if (auVar98._0_4_ < auVar173._0_4_) {
            auVar154 = vfmadd231ss_fma(ZEXT416((uint)(auVar226._0_4_ + auVar173._0_4_)),
                                       local_7a0._0_16_,ZEXT416(0x36000000));
            auVar98 = vandps_avx(ZEXT416((uint)fVar128),auVar227);
            if (auVar98._0_4_ < auVar154._0_4_) {
              bVar66 = uVar65 < 5;
              fVar126 = auVar73._0_4_ + (float)local_8b0._0_4_;
              if (fVar126 < fVar68) {
                bVar67 = 0;
                goto LAB_01142c57;
              }
              fVar127 = *(float *)(ray + k * 4 + 0x80);
              auVar226 = ZEXT3264(_local_a20);
              if (fVar126 <= fVar127) {
                auVar98 = vmovshdup_avx(auVar73);
                bVar67 = 0;
                if ((auVar98._0_4_ < 0.0) || (bVar67 = 0, 1.0 < auVar98._0_4_)) goto LAB_01142c69;
                auVar132 = vrsqrtss_avx(auVar132,auVar132);
                fVar128 = auVar132._0_4_;
                pGVar2 = (context->scene->geometries).items[uVar63].ptr;
                if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar67 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar96 = fVar128 * 1.5 + fVar96 * -0.5 * fVar128 * fVar128 * fVar128;
                    local_aa0 = auVar72._0_4_;
                    fStack_a9c = auVar72._4_4_;
                    fStack_a98 = auVar72._8_4_;
                    fStack_a94 = auVar72._12_4_;
                    auVar136._0_4_ = fVar96 * local_aa0;
                    auVar136._4_4_ = fVar96 * fStack_a9c;
                    auVar136._8_4_ = fVar96 * fStack_a98;
                    auVar136._12_4_ = fVar96 * fStack_a94;
                    auVar154 = vfmadd213ps_fma(auVar71,auVar136,auVar215);
                    auVar132 = vshufps_avx(auVar136,auVar136,0xc9);
                    auVar98 = vshufps_avx(auVar215,auVar215,0xc9);
                    auVar137._0_4_ = auVar136._0_4_ * auVar98._0_4_;
                    auVar137._4_4_ = auVar136._4_4_ * auVar98._4_4_;
                    auVar137._8_4_ = auVar136._8_4_ * auVar98._8_4_;
                    auVar137._12_4_ = auVar136._12_4_ * auVar98._12_4_;
                    auVar72 = vfmsub231ps_fma(auVar137,auVar215,auVar132);
                    auVar132 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar98 = vshufps_avx(auVar154,auVar154,0xc9);
                    auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                    auVar79._0_4_ = auVar154._0_4_ * auVar72._0_4_;
                    auVar79._4_4_ = auVar154._4_4_ * auVar72._4_4_;
                    auVar79._8_4_ = auVar154._8_4_ * auVar72._8_4_;
                    auVar79._12_4_ = auVar154._12_4_ * auVar72._12_4_;
                    auVar132 = vfmsub231ps_fma(auVar79,auVar132,auVar98);
                    local_6d0 = vshufps_avx(auVar73,auVar73,0x55);
                    local_700 = (RTCHitN  [16])vshufps_avx(auVar132,auVar132,0x55);
                    auStack_6f0 = vshufps_avx(auVar132,auVar132,0xaa);
                    local_6e0 = auVar132._0_4_;
                    local_6c0 = ZEXT416(0) << 0x20;
                    local_6b0 = CONCAT44(uStack_71c,local_720);
                    uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                    local_6a0._4_4_ = uStack_70c;
                    local_6a0._0_4_ = local_710;
                    local_6a0._8_4_ = uStack_708;
                    local_6a0._12_4_ = uStack_704;
                    vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                    uStack_68c = context->user->instID[0];
                    local_690 = uStack_68c;
                    uStack_688 = uStack_68c;
                    uStack_684 = uStack_68c;
                    uStack_680 = context->user->instPrimID[0];
                    uStack_67c = uStack_680;
                    uStack_678 = uStack_680;
                    uStack_674 = uStack_680;
                    *(float *)(ray + k * 4 + 0x80) = fVar126;
                    auVar73 = *(undefined1 (*) [16])
                               (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_860._0_16_ = auVar73;
                    local_a50.valid = (int *)local_860;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_700;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar244 = ZEXT1664(auVar99);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar226 = ZEXT3264(_local_a20);
                      auVar73 = local_860._0_16_;
                    }
                    if (auVar73 == (undefined1  [16])0x0) {
                      auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar73 = auVar73 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar226 = ZEXT3264(_local_a20);
                        auVar73 = local_860._0_16_;
                      }
                      auVar132 = vpcmpeqd_avx(auVar73,_DAT_01f45a50);
                      auVar73 = auVar132 ^ _DAT_01f46b70;
                      auVar138._8_4_ = 0xff800000;
                      auVar138._0_8_ = 0xff800000ff800000;
                      auVar138._12_4_ = 0xff800000;
                      auVar132 = vblendvps_avx(auVar138,*(undefined1 (*) [16])(local_a50.ray + 0x80)
                                               ,auVar132);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar132;
                    }
                    auVar106._8_8_ = 0x100000001;
                    auVar106._0_8_ = 0x100000001;
                    bVar67 = (auVar106 & auVar73) != (undefined1  [16])0x0;
                    if (!(bool)bVar67) {
                      *(float *)(ray + k * 4 + 0x80) = fVar127;
                    }
                  }
                  goto LAB_01142c69;
                }
              }
              bVar67 = 0;
              goto LAB_01142c69;
            }
          }
        }
        bVar66 = false;
LAB_01142c57:
        auVar226 = ZEXT3264(_local_a20);
LAB_01142c69:
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar232._4_4_ = uVar69;
        auVar232._0_4_ = uVar69;
        auVar232._8_4_ = uVar69;
        auVar232._12_4_ = uVar69;
        auVar232._16_4_ = uVar69;
        auVar232._20_4_ = uVar69;
        auVar232._24_4_ = uVar69;
        auVar232._28_4_ = uVar69;
        auVar234 = ZEXT3264(auVar232);
        bVar64 = bVar64 | bVar66 & bVar67;
        auVar114 = vcmpps_avx(_local_820,auVar232,2);
        local_4c0 = vandps_avx(auVar114,local_4c0);
      }
      auVar91._0_4_ = (float)local_880._0_4_ + (float)local_840._0_4_;
      auVar91._4_4_ = (float)local_880._4_4_ + (float)local_840._4_4_;
      auVar91._8_4_ = fStack_878 + fStack_838;
      auVar91._12_4_ = fStack_874 + fStack_834;
      auVar91._16_4_ = fStack_870 + fStack_830;
      auVar91._20_4_ = fStack_86c + fStack_82c;
      auVar91._24_4_ = fStack_868 + fStack_828;
      auVar91._28_4_ = fStack_864 + fStack_824;
      uVar69 = auVar234._0_4_;
      auVar121._4_4_ = uVar69;
      auVar121._0_4_ = uVar69;
      auVar121._8_4_ = uVar69;
      auVar121._12_4_ = uVar69;
      auVar121._16_4_ = uVar69;
      auVar121._20_4_ = uVar69;
      auVar121._24_4_ = uVar69;
      auVar121._28_4_ = uVar69;
      auVar203 = vcmpps_avx(auVar91,auVar121,2);
      _local_820 = vandps_avx(auVar203,auVar226._0_32_);
      auVar92._8_4_ = 3;
      auVar92._0_8_ = 0x300000003;
      auVar92._12_4_ = 3;
      auVar92._16_4_ = 3;
      auVar92._20_4_ = 3;
      auVar92._24_4_ = 3;
      auVar92._28_4_ = 3;
      auVar122._8_4_ = 2;
      auVar122._0_8_ = 0x200000002;
      auVar122._12_4_ = 2;
      auVar122._16_4_ = 2;
      auVar122._20_4_ = 2;
      auVar122._24_4_ = 2;
      auVar122._28_4_ = 2;
      auVar203 = vblendvps_avx(auVar122,auVar92,local_600);
      _local_840 = vpcmpgtd_avx2(auVar203,local_620);
      local_860 = vpandn_avx2(_local_840,_local_820);
      local_a20._4_4_ = (float)local_880._4_4_ + (float)local_460._4_4_;
      local_a20._0_4_ = (float)local_880._0_4_ + (float)local_460._0_4_;
      fStack_a18 = fStack_878 + fStack_458;
      fStack_a14 = fStack_874 + fStack_454;
      fStack_a10 = fStack_870 + fStack_450;
      fStack_a0c = fStack_86c + fStack_44c;
      fStack_a08 = fStack_868 + fStack_448;
      fStack_a04 = fStack_864 + fStack_444;
      auVar272 = ZEXT3264(local_9a0);
      for (; (((((((local_860 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                  (local_860 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_860 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                SUB321(local_860 >> 0x7f,0) != '\0') ||
               (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              SUB321(local_860 >> 0xbf,0) != '\0') ||
             (local_860 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             local_860[0x1f] < '\0'; local_860 = vandps_avx(auVar203,local_860)) {
        auVar123._8_4_ = 0x7f800000;
        auVar123._0_8_ = 0x7f8000007f800000;
        auVar123._12_4_ = 0x7f800000;
        auVar123._16_4_ = 0x7f800000;
        auVar123._20_4_ = 0x7f800000;
        auVar123._24_4_ = 0x7f800000;
        auVar123._28_4_ = 0x7f800000;
        auVar203 = vblendvps_avx(auVar123,auVar114,local_860);
        auVar237 = vshufps_avx(auVar203,auVar203,0xb1);
        auVar237 = vminps_avx(auVar203,auVar237);
        auVar144 = vshufpd_avx(auVar237,auVar237,5);
        auVar237 = vminps_avx(auVar237,auVar144);
        auVar144 = vpermpd_avx2(auVar237,0x4e);
        auVar237 = vminps_avx(auVar237,auVar144);
        auVar237 = vcmpps_avx(auVar203,auVar237,0);
        auVar144 = local_860 & auVar237;
        auVar203 = local_860;
        if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar144 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar144 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar144 >> 0x7f,0) != '\0') ||
              (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar144 >> 0xbf,0) != '\0') ||
            (auVar144 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar144[0x1f] < '\0') {
          auVar203 = vandps_avx(auVar237,local_860);
        }
        uVar58 = vmovmskps_avx(auVar203);
        iVar16 = 0;
        for (; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x80000000) {
          iVar16 = iVar16 + 1;
        }
        uVar61 = (ulong)(uint)(iVar16 << 2);
        *(undefined4 *)(local_860 + uVar61) = 0;
        uVar58 = *(uint *)(local_1c0 + uVar61);
        uVar62 = *(uint *)(local_440 + uVar61);
        fVar96 = auVar6._0_4_;
        if ((float)local_960._0_4_ < 0.0) {
          auVar244 = ZEXT1664(auVar244._0_16_);
          fVar96 = sqrtf((float)local_960._0_4_);
          auVar272 = ZEXT3264(local_9a0);
          uVar61 = extraout_RAX_03;
        }
        auVar132 = vminps_avx(auVar7,auVar9);
        auVar73 = vmaxps_avx(auVar7,auVar9);
        auVar98 = vminps_avx(auVar8,auVar74);
        auVar72 = vminps_avx(auVar132,auVar98);
        auVar132 = vmaxps_avx(auVar8,auVar74);
        auVar98 = vmaxps_avx(auVar73,auVar132);
        auVar73 = vandps_avx(auVar72,auVar227);
        auVar132 = vandps_avx(auVar98,auVar227);
        auVar73 = vmaxps_avx(auVar73,auVar132);
        auVar132 = vmovshdup_avx(auVar73);
        auVar132 = vmaxss_avx(auVar132,auVar73);
        auVar73 = vshufpd_avx(auVar73,auVar73,1);
        auVar73 = vmaxss_avx(auVar73,auVar132);
        local_920._0_4_ = auVar73._0_4_ * 1.9073486e-06;
        local_9c0._0_4_ = fVar96 * 1.9073486e-06;
        local_7a0._0_16_ = vshufps_avx(auVar98,auVar98,0xff);
        auVar73 = vinsertps_avx(ZEXT416(uVar62),ZEXT416(uVar58),0x10);
        for (uVar65 = 0; bVar67 = (byte)uVar61, uVar65 != 5; uVar65 = uVar65 + 1) {
          auVar98 = vmovshdup_avx(auVar73);
          fVar131 = 1.0 - auVar98._0_4_;
          auVar132 = vshufps_avx(auVar73,auVar73,0x55);
          fVar96 = auVar132._0_4_;
          auVar107._0_4_ = fVar94 * fVar96;
          fVar126 = auVar132._4_4_;
          auVar107._4_4_ = auVar9._4_4_ * fVar126;
          fVar127 = auVar132._8_4_;
          auVar107._8_4_ = auVar9._8_4_ * fVar127;
          fVar128 = auVar132._12_4_;
          auVar107._12_4_ = auVar9._12_4_ * fVar128;
          auVar139._4_4_ = fVar131;
          auVar139._0_4_ = fVar131;
          auVar139._8_4_ = fVar131;
          auVar139._12_4_ = fVar131;
          auVar132 = vfmadd231ps_fma(auVar107,auVar139,auVar7);
          auVar160._0_4_ = fVar95 * fVar96;
          auVar160._4_4_ = auVar8._4_4_ * fVar126;
          auVar160._8_4_ = auVar8._8_4_ * fVar127;
          auVar160._12_4_ = auVar8._12_4_ * fVar128;
          auVar72 = vfmadd231ps_fma(auVar160,auVar139,auVar9);
          auVar190._0_4_ = fVar96 * auVar72._0_4_;
          auVar190._4_4_ = fVar126 * auVar72._4_4_;
          auVar190._8_4_ = fVar127 * auVar72._8_4_;
          auVar190._12_4_ = fVar128 * auVar72._12_4_;
          auVar99 = vfmadd231ps_fma(auVar190,auVar139,auVar132);
          auVar108._0_4_ = fVar96 * fVar93;
          auVar108._4_4_ = fVar126 * fStack_adc;
          auVar108._8_4_ = fVar127 * fStack_ad8;
          auVar108._12_4_ = fVar128 * fStack_ad4;
          auVar132 = vfmadd231ps_fma(auVar108,auVar139,auVar8);
          auVar177._0_4_ = fVar96 * auVar132._0_4_;
          auVar177._4_4_ = fVar126 * auVar132._4_4_;
          auVar177._8_4_ = fVar127 * auVar132._8_4_;
          auVar177._12_4_ = fVar128 * auVar132._12_4_;
          auVar154 = vfmadd231ps_fma(auVar177,auVar139,auVar72);
          fVar129 = auVar73._0_4_;
          auVar109._4_4_ = fVar129;
          auVar109._0_4_ = fVar129;
          auVar109._8_4_ = fVar129;
          auVar109._12_4_ = fVar129;
          auVar132 = vfmadd213ps_fma(auVar109,local_950,_DAT_01f45a50);
          auVar80._0_4_ = fVar96 * auVar154._0_4_;
          auVar80._4_4_ = fVar126 * auVar154._4_4_;
          auVar80._8_4_ = fVar127 * auVar154._8_4_;
          auVar80._12_4_ = fVar128 * auVar154._12_4_;
          auVar72 = vfmadd231ps_fma(auVar80,auVar99,auVar139);
          local_8e0._0_16_ = auVar72;
          auVar72 = vsubps_avx(auVar132,auVar72);
          auVar132 = vdpps_avx(auVar72,auVar72,0x7f);
          fVar96 = auVar132._0_4_;
          if (fVar96 < 0.0) {
            local_980._0_16_ = auVar99;
            auVar251._0_4_ = sqrtf(fVar96);
            auVar251._4_60_ = extraout_var_00;
            auVar77 = auVar251._0_16_;
            uVar61 = extraout_RAX_04;
            auVar99 = local_980._0_16_;
          }
          else {
            auVar77 = vsqrtss_avx(auVar132,auVar132);
          }
          auVar99 = vsubps_avx(auVar154,auVar99);
          auVar216._0_4_ = auVar99._0_4_ * 3.0;
          auVar216._4_4_ = auVar99._4_4_ * 3.0;
          auVar216._8_4_ = auVar99._8_4_ * 3.0;
          auVar216._12_4_ = auVar99._12_4_ * 3.0;
          auVar99 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),ZEXT416((uint)fVar131),auVar98);
          auVar154 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar98,ZEXT416((uint)fVar131));
          fVar131 = fVar131 * 6.0;
          fVar126 = auVar99._0_4_ * 6.0;
          fVar127 = auVar154._0_4_ * 6.0;
          fVar128 = auVar98._0_4_ * 6.0;
          auVar161._0_4_ = fVar128 * fVar93;
          auVar161._4_4_ = fVar128 * fStack_adc;
          auVar161._8_4_ = fVar128 * fStack_ad8;
          auVar161._12_4_ = fVar128 * fStack_ad4;
          auVar110._4_4_ = fVar127;
          auVar110._0_4_ = fVar127;
          auVar110._8_4_ = fVar127;
          auVar110._12_4_ = fVar127;
          auVar98 = vfmadd132ps_fma(auVar110,auVar161,auVar8);
          auVar162._4_4_ = fVar126;
          auVar162._0_4_ = fVar126;
          auVar162._8_4_ = fVar126;
          auVar162._12_4_ = fVar126;
          auVar98 = vfmadd132ps_fma(auVar162,auVar98,auVar9);
          auVar99 = vdpps_avx(auVar216,auVar216,0x7f);
          auVar111._4_4_ = fVar131;
          auVar111._0_4_ = fVar131;
          auVar111._8_4_ = fVar131;
          auVar111._12_4_ = fVar131;
          auVar71 = vfmadd132ps_fma(auVar111,auVar98,auVar7);
          auVar98 = vblendps_avx(auVar99,_DAT_01f45a50,0xe);
          auVar154 = vrsqrtss_avx(auVar98,auVar98);
          fVar128 = auVar99._0_4_;
          fVar126 = auVar154._0_4_;
          auVar154 = vdpps_avx(auVar216,auVar71,0x7f);
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar112._0_4_ = auVar71._0_4_ * fVar128;
          auVar112._4_4_ = auVar71._4_4_ * fVar128;
          auVar112._8_4_ = auVar71._8_4_ * fVar128;
          auVar112._12_4_ = auVar71._12_4_ * fVar128;
          fVar127 = auVar154._0_4_;
          auVar191._0_4_ = auVar216._0_4_ * fVar127;
          auVar191._4_4_ = auVar216._4_4_ * fVar127;
          auVar191._8_4_ = auVar216._8_4_ * fVar127;
          auVar191._12_4_ = auVar216._12_4_ * fVar127;
          auVar154 = vsubps_avx(auVar112,auVar191);
          auVar98 = vrcpss_avx(auVar98,auVar98);
          auVar71 = vfnmadd213ss_fma(auVar98,auVar99,ZEXT416(0x40000000));
          fVar127 = auVar98._0_4_ * auVar71._0_4_;
          auVar98 = vmaxss_avx(ZEXT416((uint)local_920._0_4_),
                               ZEXT416((uint)(fVar129 * (float)local_9c0._0_4_)));
          auVar244 = ZEXT1664(auVar98);
          uVar51 = CONCAT44(auVar216._4_4_,auVar216._0_4_);
          auVar236._0_8_ = uVar51 ^ 0x8000000080000000;
          auVar236._8_4_ = -auVar216._8_4_;
          auVar236._12_4_ = -auVar216._12_4_;
          auVar163._0_4_ = fVar126 * auVar154._0_4_ * fVar127;
          auVar163._4_4_ = fVar126 * auVar154._4_4_ * fVar127;
          auVar163._8_4_ = fVar126 * auVar154._8_4_ * fVar127;
          auVar163._12_4_ = fVar126 * auVar154._12_4_ * fVar127;
          auVar202._0_4_ = auVar216._0_4_ * fVar126;
          auVar202._4_4_ = auVar216._4_4_ * fVar126;
          auVar202._8_4_ = auVar216._8_4_ * fVar126;
          auVar202._12_4_ = auVar216._12_4_ * fVar126;
          if (fVar128 < -fVar128) {
            local_980._0_4_ = auVar77._0_4_;
            local_9e0._0_16_ = auVar202;
            local_a00._0_16_ = auVar163;
            fVar126 = sqrtf(fVar128);
            auVar77 = ZEXT416((uint)local_980._0_4_);
            auVar244 = ZEXT464(auVar98._0_4_);
            uVar61 = extraout_RAX_05;
            auVar163 = local_a00._0_16_;
            auVar202 = local_9e0._0_16_;
          }
          else {
            auVar99 = vsqrtss_avx(auVar99,auVar99);
            fVar126 = auVar99._0_4_;
          }
          auVar99 = vdpps_avx(auVar72,auVar202,0x7f);
          auVar173 = vfmadd213ss_fma(ZEXT416((uint)local_920._0_4_),auVar77,auVar244._0_16_);
          auVar154 = vdpps_avx(auVar236,auVar202,0x7f);
          auVar71 = vdpps_avx(auVar72,auVar163,0x7f);
          auVar97 = vdpps_avx(local_950,auVar202,0x7f);
          auVar184 = vfmadd213ss_fma(ZEXT416((uint)(auVar77._0_4_ + 1.0)),
                                     ZEXT416((uint)((float)local_920._0_4_ / fVar126)),auVar173);
          fVar127 = auVar99._0_4_;
          auVar81._0_4_ = fVar127 * fVar127;
          auVar81._4_4_ = auVar99._4_4_ * auVar99._4_4_;
          auVar81._8_4_ = auVar99._8_4_ * auVar99._8_4_;
          auVar81._12_4_ = auVar99._12_4_ * auVar99._12_4_;
          auVar77 = vdpps_avx(auVar72,auVar236,0x7f);
          auVar134 = vsubps_avx(auVar132,auVar81);
          auVar173 = vrsqrtss_avx(auVar134,auVar134);
          fVar128 = auVar134._0_4_;
          fVar126 = auVar173._0_4_;
          fVar126 = fVar126 * 1.5 + fVar128 * -0.5 * fVar126 * fVar126 * fVar126;
          auVar173 = vdpps_avx(auVar72,local_950,0x7f);
          local_980._0_16_ = ZEXT416((uint)(auVar154._0_4_ + auVar71._0_4_));
          auVar154 = vfnmadd231ss_fma(auVar77,auVar99,local_980._0_16_);
          auVar77 = vfnmadd231ss_fma(auVar173,auVar99,auVar97);
          if (fVar128 < 0.0) {
            local_9e0._0_4_ = auVar184._0_4_;
            local_a00._0_16_ = auVar97;
            local_740._0_16_ = auVar154;
            local_760._0_4_ = fVar126;
            local_780._0_16_ = auVar77;
            fVar128 = sqrtf(fVar128);
            auVar244 = ZEXT464(auVar98._0_4_);
            uVar61 = extraout_RAX_06;
            fVar126 = (float)local_760._0_4_;
            auVar77 = local_780._0_16_;
            auVar97 = local_a00._0_16_;
            auVar154 = local_740._0_16_;
            fVar131 = (float)local_9e0._0_4_;
          }
          else {
            auVar98 = vsqrtss_avx(auVar134,auVar134);
            fVar128 = auVar98._0_4_;
            fVar131 = auVar184._0_4_;
          }
          auVar272 = ZEXT3264(local_9a0);
          auVar98 = vpermilps_avx(local_8e0._0_16_,0xff);
          fVar128 = fVar128 - auVar98._0_4_;
          auVar71 = vshufps_avx(auVar216,auVar216,0xff);
          auVar98 = vfmsub213ss_fma(auVar154,ZEXT416((uint)fVar126),auVar71);
          auVar164._0_8_ = auVar97._0_8_ ^ 0x8000000080000000;
          auVar164._8_4_ = auVar97._8_4_ ^ 0x80000000;
          auVar164._12_4_ = auVar97._12_4_ ^ 0x80000000;
          auVar178._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
          auVar178._8_4_ = auVar98._8_4_ ^ 0x80000000;
          auVar178._12_4_ = auVar98._12_4_ ^ 0x80000000;
          auVar77 = ZEXT416((uint)(auVar77._0_4_ * fVar126));
          auVar154 = vfmsub231ss_fma(ZEXT416((uint)(auVar98._0_4_ * auVar97._0_4_)),local_980._0_16_
                                     ,auVar77);
          auVar98 = vinsertps_avx(auVar178,auVar77,0x1c);
          uVar69 = auVar154._0_4_;
          auVar179._4_4_ = uVar69;
          auVar179._0_4_ = uVar69;
          auVar179._8_4_ = uVar69;
          auVar179._12_4_ = uVar69;
          auVar98 = vdivps_avx(auVar98,auVar179);
          auVar154 = vinsertps_avx(local_980._0_16_,auVar164,0x10);
          auVar154 = vdivps_avx(auVar154,auVar179);
          auVar140._0_4_ = fVar127 * auVar98._0_4_ + fVar128 * auVar154._0_4_;
          auVar140._4_4_ = fVar127 * auVar98._4_4_ + fVar128 * auVar154._4_4_;
          auVar140._8_4_ = fVar127 * auVar98._8_4_ + fVar128 * auVar154._8_4_;
          auVar140._12_4_ = fVar127 * auVar98._12_4_ + fVar128 * auVar154._12_4_;
          auVar73 = vsubps_avx(auVar73,auVar140);
          auVar98 = vandps_avx(auVar99,auVar227);
          if (auVar98._0_4_ < fVar131) {
            auVar99 = vfmadd231ss_fma(ZEXT416((uint)(auVar244._0_4_ + fVar131)),local_7a0._0_16_,
                                      ZEXT416(0x36000000));
            auVar98 = vandps_avx(ZEXT416((uint)fVar128),auVar227);
            if (auVar98._0_4_ < auVar99._0_4_) {
              bVar66 = uVar65 < 5;
              fVar126 = auVar73._0_4_ + (float)local_8b0._0_4_;
              if ((fVar68 <= fVar126) &&
                 (fVar127 = *(float *)(ray + k * 4 + 0x80), fVar126 <= fVar127)) {
                auVar98 = vmovshdup_avx(auVar73);
                bVar67 = 0;
                if ((auVar98._0_4_ < 0.0) || (1.0 < auVar98._0_4_)) goto LAB_01143688;
                auVar132 = vrsqrtss_avx(auVar132,auVar132);
                fVar128 = auVar132._0_4_;
                pGVar2 = (context->scene->geometries).items[uVar63].ptr;
                if ((pGVar2->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar67 = 1, pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar96 = fVar128 * 1.5 + fVar96 * -0.5 * fVar128 * fVar128 * fVar128;
                    local_aa0 = auVar72._0_4_;
                    fStack_a9c = auVar72._4_4_;
                    fStack_a98 = auVar72._8_4_;
                    fStack_a94 = auVar72._12_4_;
                    auVar141._0_4_ = fVar96 * local_aa0;
                    auVar141._4_4_ = fVar96 * fStack_a9c;
                    auVar141._8_4_ = fVar96 * fStack_a98;
                    auVar141._12_4_ = fVar96 * fStack_a94;
                    auVar99 = vfmadd213ps_fma(auVar71,auVar141,auVar216);
                    auVar132 = vshufps_avx(auVar141,auVar141,0xc9);
                    auVar98 = vshufps_avx(auVar216,auVar216,0xc9);
                    auVar142._0_4_ = auVar141._0_4_ * auVar98._0_4_;
                    auVar142._4_4_ = auVar141._4_4_ * auVar98._4_4_;
                    auVar142._8_4_ = auVar141._8_4_ * auVar98._8_4_;
                    auVar142._12_4_ = auVar141._12_4_ * auVar98._12_4_;
                    auVar72 = vfmsub231ps_fma(auVar142,auVar216,auVar132);
                    auVar132 = vshufps_avx(auVar72,auVar72,0xc9);
                    auVar98 = vshufps_avx(auVar99,auVar99,0xc9);
                    auVar72 = vshufps_avx(auVar72,auVar72,0xd2);
                    auVar82._0_4_ = auVar99._0_4_ * auVar72._0_4_;
                    auVar82._4_4_ = auVar99._4_4_ * auVar72._4_4_;
                    auVar82._8_4_ = auVar99._8_4_ * auVar72._8_4_;
                    auVar82._12_4_ = auVar99._12_4_ * auVar72._12_4_;
                    auVar132 = vfmsub231ps_fma(auVar82,auVar132,auVar98);
                    local_6d0 = vshufps_avx(auVar73,auVar73,0x55);
                    local_700 = (RTCHitN  [16])vshufps_avx(auVar132,auVar132,0x55);
                    auStack_6f0 = vshufps_avx(auVar132,auVar132,0xaa);
                    local_6e0 = auVar132._0_4_;
                    local_6c0 = ZEXT416(0) << 0x20;
                    local_6b0 = CONCAT44(uStack_71c,local_720);
                    uStack_6a8 = CONCAT44(uStack_714,uStack_718);
                    local_6a0._4_4_ = uStack_70c;
                    local_6a0._0_4_ = local_710;
                    local_6a0._8_4_ = uStack_708;
                    local_6a0._12_4_ = uStack_704;
                    vpcmpeqd_avx2(ZEXT1632(local_6a0),ZEXT1632(local_6a0));
                    uStack_68c = context->user->instID[0];
                    local_690 = uStack_68c;
                    uStack_688 = uStack_68c;
                    uStack_684 = uStack_68c;
                    uStack_680 = context->user->instPrimID[0];
                    uStack_67c = uStack_680;
                    uStack_678 = uStack_680;
                    uStack_674 = uStack_680;
                    *(float *)(ray + k * 4 + 0x80) = fVar126;
                    local_8a0 = *(undefined1 (*) [16])
                                 (mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
                    local_a50.valid = (int *)local_8a0;
                    local_a50.geometryUserPtr = pGVar2->userPtr;
                    local_a50.context = context->user;
                    local_a50.hit = local_700;
                    local_a50.N = 4;
                    local_a50.ray = (RTCRayN *)ray;
                    uStack_6dc = local_6e0;
                    uStack_6d8 = local_6e0;
                    uStack_6d4 = local_6e0;
                    if (pGVar2->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar244 = ZEXT1664(auVar244._0_16_);
                      (*pGVar2->occlusionFilterN)(&local_a50);
                      auVar272 = ZEXT3264(local_9a0);
                    }
                    if (local_8a0 == (undefined1  [16])0x0) {
                      auVar73 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                      auVar73 = auVar73 ^ _DAT_01f46b70;
                    }
                    else {
                      p_Var3 = context->args->filter;
                      if ((p_Var3 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar2->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar244 = ZEXT1664(auVar244._0_16_);
                        (*p_Var3)(&local_a50);
                        auVar272 = ZEXT3264(local_9a0);
                      }
                      auVar132 = vpcmpeqd_avx(local_8a0,_DAT_01f45a50);
                      auVar73 = auVar132 ^ _DAT_01f46b70;
                      auVar143._8_4_ = 0xff800000;
                      auVar143._0_8_ = 0xff800000ff800000;
                      auVar143._12_4_ = 0xff800000;
                      auVar132 = vblendvps_avx(auVar143,*(undefined1 (*) [16])(local_a50.ray + 0x80)
                                               ,auVar132);
                      *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar132;
                    }
                    auVar113._8_8_ = 0x100000001;
                    auVar113._0_8_ = 0x100000001;
                    bVar67 = (auVar113 & auVar73) != (undefined1  [16])0x0;
                    if (!(bool)bVar67) {
                      *(float *)(ray + k * 4 + 0x80) = fVar127;
                    }
                  }
                  goto LAB_01143688;
                }
              }
              bVar67 = 0;
              goto LAB_01143688;
            }
          }
        }
        bVar66 = false;
LAB_01143688:
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar233._4_4_ = uVar69;
        auVar233._0_4_ = uVar69;
        auVar233._8_4_ = uVar69;
        auVar233._12_4_ = uVar69;
        auVar233._16_4_ = uVar69;
        auVar233._20_4_ = uVar69;
        auVar233._24_4_ = uVar69;
        auVar233._28_4_ = uVar69;
        auVar234 = ZEXT3264(auVar233);
        bVar64 = bVar64 | bVar66 & bVar67;
        auVar203 = vcmpps_avx(_local_a20,auVar233,2);
      }
      auVar124._0_4_ = (float)local_880._0_4_ + local_4a0._0_4_;
      auVar124._4_4_ = (float)local_880._4_4_ + local_4a0._4_4_;
      auVar124._8_4_ = fStack_878 + local_4a0._8_4_;
      auVar124._12_4_ = fStack_874 + local_4a0._12_4_;
      auVar124._16_4_ = fStack_870 + local_4a0._16_4_;
      auVar124._20_4_ = fStack_86c + local_4a0._20_4_;
      auVar124._24_4_ = fStack_868 + local_4a0._24_4_;
      auVar124._28_4_ = fStack_864 + local_4a0._28_4_;
      uVar69 = auVar234._0_4_;
      auVar171._4_4_ = uVar69;
      auVar171._0_4_ = uVar69;
      auVar171._8_4_ = uVar69;
      auVar171._12_4_ = uVar69;
      auVar171._16_4_ = uVar69;
      auVar171._20_4_ = uVar69;
      auVar171._24_4_ = uVar69;
      auVar171._28_4_ = uVar69;
      auVar203 = vcmpps_avx(auVar124,auVar171,2);
      auVar114 = vandps_avx(local_5e0,local_5c0);
      auVar114 = vandps_avx(auVar203,auVar114);
      auVar183._0_4_ = (float)local_880._0_4_ + local_460._0_4_;
      auVar183._4_4_ = (float)local_880._4_4_ + local_460._4_4_;
      auVar183._8_4_ = fStack_878 + local_460._8_4_;
      auVar183._12_4_ = fStack_874 + local_460._12_4_;
      auVar183._16_4_ = fStack_870 + local_460._16_4_;
      auVar183._20_4_ = fStack_86c + local_460._20_4_;
      auVar183._24_4_ = fStack_868 + local_460._24_4_;
      auVar183._28_4_ = fStack_864 + local_460._28_4_;
      auVar237 = vcmpps_avx(auVar183,auVar171,2);
      auVar203 = vandps_avx(_local_840,_local_820);
      auVar203 = vandps_avx(auVar237,auVar203);
      auVar203 = vorps_avx(auVar114,auVar203);
      if ((((((((auVar203 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar203 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar203 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar203 >> 0x7f,0) != '\0') ||
            (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar203 >> 0xbf,0) != '\0') ||
          (auVar203 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar203[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar59 * 0x60) = auVar203;
        auVar114 = vblendvps_avx(_local_460,local_4a0,auVar114);
        *(undefined1 (*) [32])(auStack_160 + uVar59 * 0x60) = auVar114;
        uVar61 = vmovlps_avx(local_590);
        (&uStack_140)[uVar59 * 0xc] = uVar61;
        aiStack_138[uVar59 * 0x18] = local_c04 + 1;
        uVar59 = (ulong)((int)uVar59 + 1);
      }
      auVar251 = ZEXT3264(CONCAT824(uStack_928,CONCAT816(uStack_930,CONCAT88(uStack_938,local_940)))
                         );
      auVar261 = ZEXT3264(local_900);
      fVar96 = (float)local_880._0_4_;
      fVar126 = (float)local_880._4_4_;
      fVar127 = fStack_878;
      fVar128 = fStack_874;
      fVar131 = fStack_870;
      fVar129 = fStack_86c;
      fVar130 = fStack_868;
      fVar198 = fStack_864;
    }
    while( true ) {
      auVar144 = local_540;
      auVar203 = local_560;
      uVar58 = (uint)uVar59;
      if (uVar58 == 0) {
        if (bVar64 != 0) goto LAB_01143b7f;
        uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar83._4_4_ = uVar69;
        auVar83._0_4_ = uVar69;
        auVar83._8_4_ = uVar69;
        auVar83._12_4_ = uVar69;
        auVar4 = vcmpps_avx(local_5a0,auVar83,2);
        uVar63 = vmovmskps_avx(auVar4);
        uVar63 = uVar63 & (uint)local_888 - 1 & (uint)local_888;
        goto LAB_01141515;
      }
      uVar59 = (ulong)(uVar58 - 1);
      lVar60 = uVar59 * 0x60;
      auVar114 = *(undefined1 (*) [32])(auStack_160 + lVar60);
      auVar88._0_4_ = fVar96 + auVar114._0_4_;
      auVar88._4_4_ = fVar126 + auVar114._4_4_;
      auVar88._8_4_ = fVar127 + auVar114._8_4_;
      auVar88._12_4_ = fVar128 + auVar114._12_4_;
      auVar88._16_4_ = fVar131 + auVar114._16_4_;
      auVar88._20_4_ = fVar129 + auVar114._20_4_;
      auVar88._24_4_ = fVar130 + auVar114._24_4_;
      auVar88._28_4_ = fVar198 + auVar114._28_4_;
      uVar69 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar170._4_4_ = uVar69;
      auVar170._0_4_ = uVar69;
      auVar170._8_4_ = uVar69;
      auVar170._12_4_ = uVar69;
      auVar170._16_4_ = uVar69;
      auVar170._20_4_ = uVar69;
      auVar170._24_4_ = uVar69;
      auVar170._28_4_ = uVar69;
      auVar237 = vcmpps_avx(auVar88,auVar170,2);
      _local_700 = vandps_avx(auVar237,*(undefined1 (*) [32])(auStack_180 + lVar60));
      auVar237 = *(undefined1 (*) [32])(auStack_180 + lVar60) & auVar237;
      if ((((((((auVar237 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar237 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar237 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar237 >> 0x7f,0) != '\0') ||
            (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar237 >> 0xbf,0) != '\0') ||
          (auVar237 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar237[0x1f] < '\0') break;
      uVar59 = (ulong)(uVar58 - 1);
    }
    auVar146._8_4_ = 0x7f800000;
    auVar146._0_8_ = 0x7f8000007f800000;
    auVar146._12_4_ = 0x7f800000;
    auVar146._16_4_ = 0x7f800000;
    auVar146._20_4_ = 0x7f800000;
    auVar146._24_4_ = 0x7f800000;
    auVar146._28_4_ = 0x7f800000;
    auVar114 = vblendvps_avx(auVar146,auVar114,_local_700);
    auVar237 = vshufps_avx(auVar114,auVar114,0xb1);
    auVar237 = vminps_avx(auVar114,auVar237);
    auVar11 = vshufpd_avx(auVar237,auVar237,5);
    auVar237 = vminps_avx(auVar237,auVar11);
    auVar11 = vpermpd_avx2(auVar237,0x4e);
    auVar237 = vminps_avx(auVar237,auVar11);
    auVar237 = vcmpps_avx(auVar114,auVar237,0);
    auVar11 = _local_700 & auVar237;
    auVar114 = _local_700;
    if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0x7f,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar11 >> 0xbf,0) != '\0') ||
        (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar11[0x1f] < '\0')
    {
      auVar114 = vandps_avx(auVar237,_local_700);
    }
    auVar226 = ZEXT3264(local_560);
    uVar62 = vmovmskps_avx(auVar114);
    iVar16 = 0;
    for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x80000000) {
      iVar16 = iVar16 + 1;
    }
    *(undefined4 *)(local_700 + (uint)(iVar16 << 2)) = 0;
    uVar61 = (&uStack_140)[uVar59 * 0xc];
    auVar75._8_8_ = 0;
    auVar75._0_8_ = uVar61;
    local_c04 = aiStack_138[uVar59 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar60) = _local_700;
    uVar62 = uVar58 - 1;
    if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_700 >> 0x7f,0) != '\0') ||
          (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_700 >> 0xbf,0) != '\0') ||
        (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_700[0x1f] < '\0') {
      uVar62 = uVar58;
    }
    uVar69 = (undefined4)uVar61;
    auVar118._4_4_ = uVar69;
    auVar118._0_4_ = uVar69;
    auVar118._8_4_ = uVar69;
    auVar118._12_4_ = uVar69;
    auVar118._16_4_ = uVar69;
    auVar118._20_4_ = uVar69;
    auVar118._24_4_ = uVar69;
    auVar118._28_4_ = uVar69;
    auVar73 = vmovshdup_avx(auVar75);
    auVar73 = vsubps_avx(auVar73,auVar75);
    auVar89._0_4_ = auVar73._0_4_;
    auVar89._4_4_ = auVar89._0_4_;
    auVar89._8_4_ = auVar89._0_4_;
    auVar89._12_4_ = auVar89._0_4_;
    auVar89._16_4_ = auVar89._0_4_;
    auVar89._20_4_ = auVar89._0_4_;
    auVar89._24_4_ = auVar89._0_4_;
    auVar89._28_4_ = auVar89._0_4_;
    auVar73 = vfmadd132ps_fma(auVar89,auVar118,_DAT_01f7b040);
    local_4a0 = ZEXT1632(auVar73);
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_4a0 + (uint)(iVar16 << 2));
    uVar59 = (ulong)uVar62;
    auVar237 = auVar272._0_32_;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }